

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  bool bVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  uint uVar53;
  uint uVar54;
  ulong uVar55;
  long lVar57;
  byte bVar58;
  uint uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  float fVar63;
  undefined4 uVar64;
  float fVar65;
  vint4 bi_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  vint4 bi_1;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar85 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar96 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar108;
  float fVar121;
  vint4 ai_2;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  vint4 ai;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar156;
  float fVar158;
  vint4 bi;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar160;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar157;
  float fVar159;
  float fVar161;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar162;
  float fVar163;
  undefined1 auVar155 [32];
  undefined8 uVar164;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar179;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar180;
  undefined1 auVar178 [32];
  float fVar184;
  float fVar200;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  vint4 ai_1;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar204 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  float fVar216;
  float fVar226;
  vfloat4 a0_3;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  float fVar227;
  float fVar238;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  vfloat4 a0_1;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  vfloat4 a0;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar256;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar266;
  float fVar267;
  undefined1 auVar257 [16];
  float fVar268;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar272 [16];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar277 [16];
  undefined1 auVar281 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_549;
  undefined4 local_548;
  undefined1 local_4c8 [16];
  int local_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  float local_488;
  float fStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  undefined4 uStack_46c;
  undefined1 local_468 [32];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  ulong local_430;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  undefined8 uStack_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  ulong local_338;
  Primitive *local_330;
  RTCFilterFunctionNArguments local_328;
  uint auStack_2f8 [4];
  undefined8 local_2e8;
  undefined4 local_2e0;
  undefined8 local_2dc;
  undefined4 local_2d4;
  undefined4 local_2d0;
  uint local_2cc;
  uint local_2c8;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  uint uStack_1d8;
  float afStack_1d4 [7];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar56;
  undefined1 auVar118 [32];
  
  PVar3 = prim[1];
  uVar62 = (ulong)(byte)PVar3;
  fVar139 = *(float *)(prim + uVar62 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar62 * 0x19 + 6));
  auVar141._0_4_ = fVar139 * (ray->dir).field_0.m128[0];
  auVar141._4_4_ = fVar139 * (ray->dir).field_0.m128[1];
  auVar141._8_4_ = fVar139 * (ray->dir).field_0.m128[2];
  auVar141._12_4_ = fVar139 * (ray->dir).field_0.m128[3];
  auVar66._0_4_ = fVar139 * auVar12._0_4_;
  auVar66._4_4_ = fVar139 * auVar12._4_4_;
  auVar66._8_4_ = fVar139 * auVar12._8_4_;
  auVar66._12_4_ = fVar139 * auVar12._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar271 = vcvtdq2ps_avx(auVar271);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar62 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar55 = (ulong)(uint)((int)(uVar62 * 9) * 2);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + uVar62 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  uVar55 = (ulong)(uint)((int)(uVar62 * 5) << 2);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar269._4_4_ = auVar141._0_4_;
  auVar269._0_4_ = auVar141._0_4_;
  auVar269._8_4_ = auVar141._0_4_;
  auVar269._12_4_ = auVar141._0_4_;
  auVar83 = vshufps_avx(auVar141,auVar141,0x55);
  auVar67 = vshufps_avx(auVar141,auVar141,0xaa);
  fVar139 = auVar67._0_4_;
  auVar239._0_4_ = fVar139 * auVar271._0_4_;
  fVar157 = auVar67._4_4_;
  auVar239._4_4_ = fVar157 * auVar271._4_4_;
  fVar159 = auVar67._8_4_;
  auVar239._8_4_ = fVar159 * auVar271._8_4_;
  fVar161 = auVar67._12_4_;
  auVar239._12_4_ = fVar161 * auVar271._12_4_;
  auVar228._0_4_ = auVar11._0_4_ * fVar139;
  auVar228._4_4_ = auVar11._4_4_ * fVar157;
  auVar228._8_4_ = auVar11._8_4_ * fVar159;
  auVar228._12_4_ = auVar11._12_4_ * fVar161;
  auVar201._0_4_ = auVar95._0_4_ * fVar139;
  auVar201._4_4_ = auVar95._4_4_ * fVar157;
  auVar201._8_4_ = auVar95._8_4_ * fVar159;
  auVar201._12_4_ = auVar95._12_4_ * fVar161;
  auVar67 = vfmadd231ps_fma(auVar239,auVar83,auVar8);
  auVar207 = vfmadd231ps_fma(auVar228,auVar83,auVar10);
  auVar83 = vfmadd231ps_fma(auVar201,auVar68,auVar83);
  auVar109 = vfmadd231ps_fma(auVar67,auVar269,auVar12);
  auVar207 = vfmadd231ps_fma(auVar207,auVar269,auVar9);
  auVar123 = vfmadd231ps_fma(auVar83,auVar69,auVar269);
  auVar270._4_4_ = auVar66._0_4_;
  auVar270._0_4_ = auVar66._0_4_;
  auVar270._8_4_ = auVar66._0_4_;
  auVar270._12_4_ = auVar66._0_4_;
  auVar83 = vshufps_avx(auVar66,auVar66,0x55);
  auVar67 = vshufps_avx(auVar66,auVar66,0xaa);
  fVar139 = auVar67._0_4_;
  auVar142._0_4_ = fVar139 * auVar271._0_4_;
  fVar157 = auVar67._4_4_;
  auVar142._4_4_ = fVar157 * auVar271._4_4_;
  fVar159 = auVar67._8_4_;
  auVar142._8_4_ = fVar159 * auVar271._8_4_;
  fVar161 = auVar67._12_4_;
  auVar142._12_4_ = fVar161 * auVar271._12_4_;
  auVar128._0_4_ = auVar11._0_4_ * fVar139;
  auVar128._4_4_ = auVar11._4_4_ * fVar157;
  auVar128._8_4_ = auVar11._8_4_ * fVar159;
  auVar128._12_4_ = auVar11._12_4_ * fVar161;
  auVar67._0_4_ = auVar95._0_4_ * fVar139;
  auVar67._4_4_ = auVar95._4_4_ * fVar157;
  auVar67._8_4_ = auVar95._8_4_ * fVar159;
  auVar67._12_4_ = auVar95._12_4_ * fVar161;
  auVar8 = vfmadd231ps_fma(auVar142,auVar83,auVar8);
  auVar271 = vfmadd231ps_fma(auVar128,auVar83,auVar10);
  auVar10 = vfmadd231ps_fma(auVar67,auVar83,auVar68);
  auVar11 = vfmadd231ps_fma(auVar8,auVar270,auVar12);
  auVar68 = vfmadd231ps_fma(auVar271,auVar270,auVar9);
  auVar95 = vfmadd231ps_fma(auVar10,auVar270,auVar69);
  local_358._8_4_ = 0x7fffffff;
  local_358._0_8_ = 0x7fffffff7fffffff;
  local_358._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar109,local_358);
  auVar122._8_4_ = 0x219392ef;
  auVar122._0_8_ = 0x219392ef219392ef;
  auVar122._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar122,1);
  auVar8 = vblendvps_avx(auVar109,auVar122,auVar12);
  auVar12 = vandps_avx(auVar207,local_358);
  auVar12 = vcmpps_avx(auVar12,auVar122,1);
  auVar271 = vblendvps_avx(auVar207,auVar122,auVar12);
  auVar12 = vandps_avx(auVar123,local_358);
  auVar12 = vcmpps_avx(auVar12,auVar122,1);
  auVar12 = vblendvps_avx(auVar123,auVar122,auVar12);
  auVar9 = vrcpps_avx(auVar8);
  auVar185._8_4_ = 0x3f800000;
  auVar185._0_8_ = &DAT_3f8000003f800000;
  auVar185._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar185);
  auVar9 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8 = vrcpps_avx(auVar271);
  auVar271 = vfnmadd213ps_fma(auVar271,auVar8,auVar185);
  auVar10 = vfmadd132ps_fma(auVar271,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar12);
  auVar271 = vfnmadd213ps_fma(auVar12,auVar8,auVar185);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar69 = vfmadd132ps_fma(auVar271,auVar8,auVar8);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar11);
  auVar123._0_4_ = auVar9._0_4_ * auVar12._0_4_;
  auVar123._4_4_ = auVar9._4_4_ * auVar12._4_4_;
  auVar123._8_4_ = auVar9._8_4_ * auVar12._8_4_;
  auVar123._12_4_ = auVar9._12_4_ * auVar12._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar8);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar11);
  auVar143._0_4_ = auVar9._0_4_ * auVar12._0_4_;
  auVar143._4_4_ = auVar9._4_4_ * auVar12._4_4_;
  auVar143._8_4_ = auVar9._8_4_ * auVar12._8_4_;
  auVar143._12_4_ = auVar9._12_4_ * auVar12._12_4_;
  auVar207._1_3_ = 0;
  auVar207[0] = PVar3;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar271);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar62 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar9);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar68);
  auVar202._0_4_ = auVar12._0_4_ * auVar10._0_4_;
  auVar202._4_4_ = auVar12._4_4_ * auVar10._4_4_;
  auVar202._8_4_ = auVar12._8_4_ * auVar10._8_4_;
  auVar202._12_4_ = auVar12._12_4_ * auVar10._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar8);
  auVar12 = vsubps_avx(auVar12,auVar68);
  auVar83._0_4_ = auVar10._0_4_ * auVar12._0_4_;
  auVar83._4_4_ = auVar10._4_4_ * auVar12._4_4_;
  auVar83._8_4_ = auVar10._8_4_ * auVar12._8_4_;
  auVar83._12_4_ = auVar10._12_4_ * auVar12._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar55 + uVar62 + 6);
  auVar12 = vpmovsxwd_avx(auVar10);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar95);
  auVar109._0_4_ = auVar69._0_4_ * auVar12._0_4_;
  auVar109._4_4_ = auVar69._4_4_ * auVar12._4_4_;
  auVar109._8_4_ = auVar69._8_4_ * auVar12._8_4_;
  auVar109._12_4_ = auVar69._12_4_ * auVar12._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar62 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar11);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar95);
  auVar68._0_4_ = auVar69._0_4_ * auVar12._0_4_;
  auVar68._4_4_ = auVar69._4_4_ * auVar12._4_4_;
  auVar68._8_4_ = auVar69._8_4_ * auVar12._8_4_;
  auVar68._12_4_ = auVar69._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar123,auVar143);
  auVar8 = vpminsd_avx(auVar202,auVar83);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  auVar8 = vpminsd_avx(auVar109,auVar68);
  uVar64 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar217._4_4_ = uVar64;
  auVar217._0_4_ = uVar64;
  auVar217._8_4_ = uVar64;
  auVar217._12_4_ = uVar64;
  auVar8 = vmaxps_avx(auVar8,auVar217);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  local_278._0_4_ = auVar12._0_4_ * 0.99999964;
  local_278._4_4_ = auVar12._4_4_ * 0.99999964;
  local_278._8_4_ = auVar12._8_4_ * 0.99999964;
  local_278._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar123,auVar143);
  auVar8 = vpmaxsd_avx(auVar202,auVar83);
  auVar12 = vminps_avx(auVar12,auVar8);
  auVar8 = vpmaxsd_avx(auVar109,auVar68);
  fVar139 = ray->tfar;
  auVar95._4_4_ = fVar139;
  auVar95._0_4_ = fVar139;
  auVar95._8_4_ = fVar139;
  auVar95._12_4_ = fVar139;
  auVar8 = vminps_avx(auVar8,auVar95);
  auVar12 = vminps_avx(auVar12,auVar8);
  auVar69._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar69._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar69._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar69._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar207[4] = PVar3;
  auVar207._5_3_ = 0;
  auVar207[8] = PVar3;
  auVar207._9_3_ = 0;
  auVar207[0xc] = PVar3;
  auVar207._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar207,_DAT_01ff0cf0);
  auVar12 = vcmpps_avx(local_278,auVar69,2);
  auVar12 = vandps_avx(auVar12,auVar8);
  uVar53 = vmovmskps_avx(auVar12);
  local_549 = uVar53 != 0;
  if (uVar53 == 0) {
    return local_549;
  }
  auVar82._16_16_ = mm_lookupmask_ps._240_16_;
  auVar82._0_16_ = mm_lookupmask_ps._240_16_;
  uVar53 = uVar53 & 0xff;
  local_1f8 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,0x80);
  local_368 = 0x80000000;
  uStack_364 = 0x80000000;
  uStack_360 = 0x80000000;
  uStack_35c = 0x80000000;
  local_330 = prim;
LAB_01652e43:
  lVar57 = 0;
  uVar62 = (ulong)uVar53;
  for (uVar55 = uVar62; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    lVar57 = lVar57 + 1;
  }
  local_430 = (ulong)*(uint *)(local_330 + 2);
  local_338 = (ulong)*(uint *)(local_330 + lVar57 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[local_430].ptr;
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_338);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar12 = *(undefined1 (*) [16])(_Var7 + uVar55 * (long)pvVar6);
  auVar8 = *(undefined1 (*) [16])(_Var7 + (uVar55 + 1) * (long)pvVar6);
  auVar271 = *(undefined1 (*) [16])(_Var7 + (uVar55 + 2) * (long)pvVar6);
  auVar9 = *(undefined1 (*) [16])(_Var7 + (long)pvVar6 * (uVar55 + 3));
  lVar57 = *(long *)&pGVar4[1].time_range.upper;
  auVar10 = *(undefined1 (*) [16])(lVar57 + (long)p_Var5 * uVar55);
  auVar11 = *(undefined1 (*) [16])(lVar57 + (long)p_Var5 * (uVar55 + 1));
  auVar69 = *(undefined1 (*) [16])(lVar57 + (long)p_Var5 * (uVar55 + 2));
  uVar62 = uVar62 - 1 & uVar62;
  auVar68 = *(undefined1 (*) [16])(lVar57 + (long)p_Var5 * (uVar55 + 3));
  if (uVar62 != 0) {
    uVar61 = uVar62 - 1 & uVar62;
    for (uVar55 = uVar62; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    }
    if (uVar61 != 0) {
      for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar207 = ZEXT816(0) << 0x40;
  auVar70._0_4_ = auVar68._0_4_ * 0.0;
  auVar70._4_4_ = auVar68._4_4_ * 0.0;
  auVar70._8_4_ = auVar68._8_4_ * 0.0;
  auVar70._12_4_ = auVar68._12_4_ * 0.0;
  auVar83 = vfmadd231ps_fma(auVar70,auVar69,auVar207);
  auVar95 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar83);
  local_448._0_4_ = auVar10._0_4_ + auVar95._0_4_;
  local_448._4_4_ = auVar10._4_4_ + auVar95._4_4_;
  fStack_440 = auVar10._8_4_ + auVar95._8_4_;
  fStack_43c = auVar10._12_4_ + auVar95._12_4_;
  auVar257._8_4_ = 0x40400000;
  auVar257._0_8_ = 0x4040000040400000;
  auVar257._12_4_ = 0x40400000;
  auVar95 = vfmadd231ps_fma(auVar83,auVar11,auVar257);
  auVar67 = vfnmadd231ps_fma(auVar95,auVar10,auVar257);
  auVar240._0_4_ = auVar9._0_4_ * 0.0;
  auVar240._4_4_ = auVar9._4_4_ * 0.0;
  auVar240._8_4_ = auVar9._8_4_ * 0.0;
  auVar240._12_4_ = auVar9._12_4_ * 0.0;
  auVar83 = vfmadd231ps_fma(auVar240,auVar271,auVar207);
  auVar95 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar8,auVar83);
  auVar249._0_4_ = auVar12._0_4_ + auVar95._0_4_;
  auVar249._4_4_ = auVar12._4_4_ + auVar95._4_4_;
  auVar249._8_4_ = auVar12._8_4_ + auVar95._8_4_;
  auVar249._12_4_ = auVar12._12_4_ + auVar95._12_4_;
  auVar95 = vfmadd231ps_fma(auVar83,auVar8,auVar257);
  auVar83 = vfnmadd231ps_fma(auVar95,auVar12,auVar257);
  auVar95 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar69,auVar68);
  auVar95 = vfmadd231ps_fma(auVar95,auVar11,auVar207);
  auVar95 = vfmadd231ps_fma(auVar95,auVar10,auVar207);
  auVar110._0_4_ = auVar68._0_4_ * 3.0;
  auVar110._4_4_ = auVar68._4_4_ * 3.0;
  auVar110._8_4_ = auVar68._8_4_ * 3.0;
  auVar110._12_4_ = auVar68._12_4_ * 3.0;
  auVar69 = vfnmadd231ps_fma(auVar110,auVar257,auVar69);
  auVar11 = vfmadd231ps_fma(auVar69,auVar207,auVar11);
  auVar69 = vfnmadd231ps_fma(auVar11,auVar207,auVar10);
  auVar10 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar271,auVar9);
  auVar10 = vfmadd231ps_fma(auVar10,auVar8,auVar207);
  auVar10 = vfmadd231ps_fma(auVar10,auVar12,auVar207);
  auVar218._0_4_ = auVar9._0_4_ * 3.0;
  auVar218._4_4_ = auVar9._4_4_ * 3.0;
  auVar218._8_4_ = auVar9._8_4_ * 3.0;
  auVar218._12_4_ = auVar9._12_4_ * 3.0;
  auVar271 = vfnmadd231ps_fma(auVar218,auVar257,auVar271);
  auVar8 = vfmadd231ps_fma(auVar271,auVar207,auVar8);
  auVar11 = vfnmadd231ps_fma(auVar8,auVar207,auVar12);
  auVar12 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar8 = vshufps_avx(auVar249,auVar249,0xc9);
  fVar63 = auVar67._0_4_;
  auVar144._0_4_ = fVar63 * auVar8._0_4_;
  fVar65 = auVar67._4_4_;
  auVar144._4_4_ = fVar65 * auVar8._4_4_;
  fVar140 = auVar67._8_4_;
  auVar144._8_4_ = fVar140 * auVar8._8_4_;
  fVar179 = auVar67._12_4_;
  auVar144._12_4_ = fVar179 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar144,auVar12,auVar249);
  auVar271 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar83,auVar83,0xc9);
  auVar145._0_4_ = fVar63 * auVar8._0_4_;
  auVar145._4_4_ = fVar65 * auVar8._4_4_;
  auVar145._8_4_ = fVar140 * auVar8._8_4_;
  auVar145._12_4_ = fVar179 * auVar8._12_4_;
  auVar12 = vfmsub231ps_fma(auVar145,auVar12,auVar83);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar8 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar108 = auVar69._0_4_;
  auVar124._0_4_ = fVar108 * auVar8._0_4_;
  fVar121 = auVar69._4_4_;
  auVar124._4_4_ = fVar121 * auVar8._4_4_;
  fVar162 = auVar69._8_4_;
  auVar124._8_4_ = fVar162 * auVar8._8_4_;
  fVar163 = auVar69._12_4_;
  auVar124._12_4_ = fVar163 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar124,auVar12,auVar10);
  auVar10 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar165._0_4_ = fVar108 * auVar8._0_4_;
  auVar165._4_4_ = fVar121 * auVar8._4_4_;
  auVar165._8_4_ = fVar162 * auVar8._8_4_;
  auVar165._12_4_ = fVar163 * auVar8._12_4_;
  auVar12 = vfmsub231ps_fma(auVar165,auVar12,auVar11);
  auVar11 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vdpps_avx(auVar271,auVar271,0x7f);
  fVar157 = auVar12._0_4_;
  auVar219._4_12_ = ZEXT812(0) << 0x20;
  auVar219._0_4_ = fVar157;
  auVar8 = vrsqrtss_avx(auVar219,auVar219);
  fVar139 = auVar8._0_4_;
  fVar159 = fVar139 * 1.5 - fVar157 * 0.5 * fVar139 * fVar139 * fVar139;
  auVar8 = vdpps_avx(auVar271,auVar9,0x7f);
  fVar138 = fVar159 * auVar271._0_4_;
  fVar156 = fVar159 * auVar271._4_4_;
  fVar158 = fVar159 * auVar271._8_4_;
  fVar160 = fVar159 * auVar271._12_4_;
  auVar229._0_4_ = auVar9._0_4_ * fVar157;
  auVar229._4_4_ = auVar9._4_4_ * fVar157;
  auVar229._8_4_ = auVar9._8_4_ * fVar157;
  auVar229._12_4_ = auVar9._12_4_ * fVar157;
  fVar139 = auVar8._0_4_;
  auVar186._0_4_ = fVar139 * auVar271._0_4_;
  auVar186._4_4_ = fVar139 * auVar271._4_4_;
  auVar186._8_4_ = fVar139 * auVar271._8_4_;
  auVar186._12_4_ = fVar139 * auVar271._12_4_;
  auVar271 = vsubps_avx(auVar229,auVar186);
  auVar8 = vrcpss_avx(auVar219,auVar219);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar8,SUB6416(ZEXT464(0x40000000),0));
  fVar139 = auVar8._0_4_ * auVar12._0_4_;
  auVar12 = vdpps_avx(auVar10,auVar10,0x7f);
  fVar157 = auVar12._0_4_;
  auVar220._4_12_ = ZEXT812(0) << 0x20;
  auVar220._0_4_ = fVar157;
  auVar8 = vrsqrtss_avx(auVar220,auVar220);
  fVar161 = auVar8._0_4_;
  auVar8 = vdpps_avx(auVar10,auVar11,0x7f);
  fVar161 = fVar161 * 1.5 - fVar157 * 0.5 * fVar161 * fVar161 * fVar161;
  fVar256 = fVar161 * auVar10._0_4_;
  fVar266 = fVar161 * auVar10._4_4_;
  fVar267 = fVar161 * auVar10._8_4_;
  fVar268 = fVar161 * auVar10._12_4_;
  auVar166._0_4_ = fVar157 * auVar11._0_4_;
  auVar166._4_4_ = fVar157 * auVar11._4_4_;
  auVar166._8_4_ = fVar157 * auVar11._8_4_;
  auVar166._12_4_ = fVar157 * auVar11._12_4_;
  fVar157 = auVar8._0_4_;
  auVar125._0_4_ = fVar157 * auVar10._0_4_;
  auVar125._4_4_ = fVar157 * auVar10._4_4_;
  auVar125._8_4_ = fVar157 * auVar10._8_4_;
  auVar125._12_4_ = fVar157 * auVar10._12_4_;
  auVar9 = vsubps_avx(auVar166,auVar125);
  auVar8 = vrcpss_avx(auVar220,auVar220);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar8,ZEXT416(0x40000000));
  fVar157 = auVar12._0_4_ * auVar8._0_4_;
  auVar12 = vshufps_avx(_local_448,_local_448,0xff);
  auVar203._0_4_ = auVar12._0_4_ * fVar138;
  auVar203._4_4_ = auVar12._4_4_ * fVar156;
  auVar203._8_4_ = auVar12._8_4_ * fVar158;
  auVar203._12_4_ = auVar12._12_4_ * fVar160;
  local_378 = vsubps_avx(_local_448,auVar203);
  auVar8 = vshufps_avx(auVar67,auVar67,0xff);
  auVar146._0_4_ = auVar8._0_4_ * fVar138 + auVar12._0_4_ * fVar159 * fVar139 * auVar271._0_4_;
  auVar146._4_4_ = auVar8._4_4_ * fVar156 + auVar12._4_4_ * fVar159 * fVar139 * auVar271._4_4_;
  auVar146._8_4_ = auVar8._8_4_ * fVar158 + auVar12._8_4_ * fVar159 * fVar139 * auVar271._8_4_;
  auVar146._12_4_ = auVar8._12_4_ * fVar160 + auVar12._12_4_ * fVar159 * fVar139 * auVar271._12_4_;
  auVar271 = vsubps_avx(auVar67,auVar146);
  local_388._0_4_ = auVar203._0_4_ + (float)local_448._0_4_;
  local_388._4_4_ = auVar203._4_4_ + (float)local_448._4_4_;
  fStack_380 = auVar203._8_4_ + fStack_440;
  fStack_37c = auVar203._12_4_ + fStack_43c;
  auVar12 = vshufps_avx(auVar95,auVar95,0xff);
  auVar84._0_4_ = fVar256 * auVar12._0_4_;
  auVar84._4_4_ = fVar266 * auVar12._4_4_;
  auVar84._8_4_ = fVar267 * auVar12._8_4_;
  auVar84._12_4_ = fVar268 * auVar12._12_4_;
  local_398 = vsubps_avx(auVar95,auVar84);
  auVar8 = vshufps_avx(auVar69,auVar69,0xff);
  auVar71._0_4_ = fVar256 * auVar8._0_4_ + auVar12._0_4_ * fVar161 * auVar9._0_4_ * fVar157;
  auVar71._4_4_ = fVar266 * auVar8._4_4_ + auVar12._4_4_ * fVar161 * auVar9._4_4_ * fVar157;
  auVar71._8_4_ = fVar267 * auVar8._8_4_ + auVar12._8_4_ * fVar161 * auVar9._8_4_ * fVar157;
  auVar71._12_4_ = fVar268 * auVar8._12_4_ + auVar12._12_4_ * fVar161 * auVar9._12_4_ * fVar157;
  auVar12 = vsubps_avx(auVar69,auVar71);
  local_3e8 = auVar95._0_4_ + auVar84._0_4_;
  fStack_3e4 = auVar95._4_4_ + auVar84._4_4_;
  fStack_3e0 = auVar95._8_4_ + auVar84._8_4_;
  fStack_3dc = auVar95._12_4_ + auVar84._12_4_;
  local_3a8._0_4_ = local_378._0_4_ + auVar271._0_4_ * 0.33333334;
  local_3a8._4_4_ = local_378._4_4_ + auVar271._4_4_ * 0.33333334;
  local_3a8._8_4_ = local_378._8_4_ + auVar271._8_4_ * 0.33333334;
  local_3a8._12_4_ = local_378._12_4_ + auVar271._12_4_ * 0.33333334;
  auVar72._0_4_ = auVar12._0_4_ * 0.33333334;
  auVar72._4_4_ = auVar12._4_4_ * 0.33333334;
  auVar72._8_4_ = auVar12._8_4_ * 0.33333334;
  auVar72._12_4_ = auVar12._12_4_ * 0.33333334;
  local_3b8 = vsubps_avx(local_398,auVar72);
  aVar1 = (ray->org).field_0;
  auVar271 = vsubps_avx(local_378,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar271,auVar271,0x55);
  auVar8 = vshufps_avx(auVar271,auVar271,0xaa);
  aVar2 = (pre->ray_space).vy.field_0;
  fVar139 = (pre->ray_space).vz.field_0.m128[0];
  fVar157 = (pre->ray_space).vz.field_0.m128[1];
  fVar159 = (pre->ray_space).vz.field_0.m128[2];
  fVar161 = (pre->ray_space).vz.field_0.m128[3];
  auVar73._0_4_ = fVar139 * auVar8._0_4_;
  auVar73._4_4_ = fVar157 * auVar8._4_4_;
  auVar73._8_4_ = fVar159 * auVar8._8_4_;
  auVar73._12_4_ = fVar161 * auVar8._12_4_;
  auVar83 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar2,auVar12);
  auVar9 = vsubps_avx(local_3a8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar9,auVar9,0x55);
  auVar8 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar74._0_4_ = fVar139 * auVar8._0_4_;
  auVar74._4_4_ = fVar157 * auVar8._4_4_;
  auVar74._8_4_ = fVar159 * auVar8._8_4_;
  auVar74._12_4_ = fVar161 * auVar8._12_4_;
  auVar67 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar2,auVar12);
  auVar8 = vsubps_avx(local_3b8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar8,auVar8,0xaa);
  auVar75._0_4_ = fVar139 * auVar12._0_4_;
  auVar75._4_4_ = fVar157 * auVar12._4_4_;
  auVar75._8_4_ = fVar159 * auVar12._8_4_;
  auVar75._12_4_ = fVar161 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar8,auVar8,0x55);
  auVar207 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar2,auVar12);
  auVar10 = vsubps_avx(local_398,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar76._0_4_ = fVar139 * auVar12._0_4_;
  auVar76._4_4_ = fVar157 * auVar12._4_4_;
  auVar76._8_4_ = fVar159 * auVar12._8_4_;
  auVar76._12_4_ = fVar161 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar10,auVar10,0x55);
  auVar109 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar2,auVar12);
  auVar11 = vsubps_avx(_local_388,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar147._0_4_ = fVar139 * auVar12._0_4_;
  auVar147._4_4_ = fVar157 * auVar12._4_4_;
  auVar147._8_4_ = fVar159 * auVar12._8_4_;
  auVar147._12_4_ = fVar161 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar11,auVar11,0x55);
  auVar123 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar12);
  local_3c8._0_4_ = (fVar63 + auVar146._0_4_) * 0.33333334 + (float)local_388._0_4_;
  local_3c8._4_4_ = (fVar65 + auVar146._4_4_) * 0.33333334 + (float)local_388._4_4_;
  fStack_3c0 = (fVar140 + auVar146._8_4_) * 0.33333334 + fStack_380;
  fStack_3bc = (fVar179 + auVar146._12_4_) * 0.33333334 + fStack_37c;
  auVar69 = vsubps_avx(_local_3c8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar241._0_4_ = fVar139 * auVar12._0_4_;
  auVar241._4_4_ = fVar157 * auVar12._4_4_;
  auVar241._8_4_ = fVar159 * auVar12._8_4_;
  auVar241._12_4_ = fVar161 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar69,auVar69,0x55);
  auVar66 = vfmadd231ps_fma(auVar241,(undefined1  [16])aVar2,auVar12);
  auVar230._0_4_ = (fVar108 + auVar71._0_4_) * 0.33333334;
  auVar230._4_4_ = (fVar121 + auVar71._4_4_) * 0.33333334;
  auVar230._8_4_ = (fVar162 + auVar71._8_4_) * 0.33333334;
  auVar230._12_4_ = (fVar163 + auVar71._12_4_) * 0.33333334;
  auVar47._4_4_ = fStack_3e4;
  auVar47._0_4_ = local_3e8;
  auVar47._8_4_ = fStack_3e0;
  auVar47._12_4_ = fStack_3dc;
  _local_3d8 = vsubps_avx(auVar47,auVar230);
  auVar68 = vsubps_avx(_local_3d8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar231._0_4_ = fVar139 * auVar12._0_4_;
  auVar231._4_4_ = fVar157 * auVar12._4_4_;
  auVar231._8_4_ = fVar159 * auVar12._8_4_;
  auVar231._12_4_ = fVar161 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar68,auVar68,0x55);
  auVar128 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar2,auVar12);
  auVar95 = vsubps_avx(auVar47,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar95,auVar95,0xaa);
  auVar187._0_4_ = fVar139 * auVar12._0_4_;
  auVar187._4_4_ = fVar157 * auVar12._4_4_;
  auVar187._8_4_ = fVar159 * auVar12._8_4_;
  auVar187._12_4_ = fVar161 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar95,auVar95,0x55);
  auVar12 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar2,auVar12);
  local_448._0_4_ = auVar271._0_4_;
  auVar167._4_4_ = local_448._0_4_;
  auVar167._0_4_ = local_448._0_4_;
  auVar167._8_4_ = local_448._0_4_;
  auVar167._12_4_ = local_448._0_4_;
  aVar2 = (pre->ray_space).vx.field_0;
  auVar83 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar2,auVar167);
  local_548 = auVar9._0_4_;
  auVar168._4_4_ = local_548;
  auVar168._0_4_ = local_548;
  auVar168._8_4_ = local_548;
  auVar168._12_4_ = local_548;
  auVar9 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar2,auVar168);
  uVar64 = auVar8._0_4_;
  auVar169._4_4_ = uVar64;
  auVar169._0_4_ = uVar64;
  auVar169._8_4_ = uVar64;
  auVar169._12_4_ = uVar64;
  auVar67 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar2,auVar169);
  uVar64 = auVar10._0_4_;
  auVar170._4_4_ = uVar64;
  auVar170._0_4_ = uVar64;
  auVar170._8_4_ = uVar64;
  auVar170._12_4_ = uVar64;
  auVar10 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar2,auVar170);
  uVar64 = auVar11._0_4_;
  auVar171._4_4_ = uVar64;
  auVar171._0_4_ = uVar64;
  auVar171._8_4_ = uVar64;
  auVar171._12_4_ = uVar64;
  auVar11 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar2,auVar171);
  uVar64 = auVar69._0_4_;
  auVar172._4_4_ = uVar64;
  auVar172._0_4_ = uVar64;
  auVar172._8_4_ = uVar64;
  auVar172._12_4_ = uVar64;
  auVar69 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar2,auVar172);
  uVar64 = auVar68._0_4_;
  auVar77._4_4_ = uVar64;
  auVar77._0_4_ = uVar64;
  auVar77._8_4_ = uVar64;
  auVar77._12_4_ = uVar64;
  auVar68 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar2,auVar77);
  uVar64 = auVar95._0_4_;
  auVar78._4_4_ = uVar64;
  auVar78._0_4_ = uVar64;
  auVar78._8_4_ = uVar64;
  auVar78._12_4_ = uVar64;
  auVar95 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar78);
  local_498 = vmovlhps_avx(auVar83,auVar11);
  local_4a8 = vmovlhps_avx(auVar9,auVar69);
  local_348 = vmovlhps_avx(auVar67,auVar68);
  _local_258 = vmovlhps_avx(auVar10,auVar95);
  auVar275 = ZEXT1664(_local_258);
  auVar12 = vminps_avx(local_498,local_4a8);
  auVar8 = vminps_avx(local_348,_local_258);
  auVar271 = vminps_avx(auVar12,auVar8);
  auVar12 = vmaxps_avx(local_498,local_4a8);
  auVar8 = vmaxps_avx(local_348,_local_258);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  auVar8 = vshufpd_avx(auVar271,auVar271,3);
  auVar271 = vminps_avx(auVar271,auVar8);
  auVar8 = vshufpd_avx(auVar12,auVar12,3);
  auVar8 = vmaxps_avx(auVar12,auVar8);
  auVar12 = vandps_avx(local_358,auVar271);
  auVar8 = vandps_avx(local_358,auVar8);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  auVar8 = vmovshdup_avx(auVar12);
  auVar12 = vmaxss_avx(auVar8,auVar12);
  local_198 = auVar12._0_4_ * 9.536743e-07;
  auVar277._8_8_ = auVar83._0_8_;
  auVar277._0_8_ = auVar83._0_8_;
  auVar204._8_8_ = auVar9._0_8_;
  auVar204._0_8_ = auVar9._0_8_;
  auVar85._8_8_ = auVar67._0_8_;
  auVar85._0_8_ = auVar67._0_8_;
  auVar96._8_8_ = auVar10._0_8_;
  auVar96._0_8_ = auVar10._0_8_;
  _local_448 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_1b8 = (uint)local_198 ^ local_368;
  uStack_1b4 = local_1b8;
  uStack_1b0 = local_1b8;
  uStack_1ac = local_1b8;
  uStack_1a8 = local_1b8;
  uStack_1a4 = local_1b8;
  uStack_1a0 = local_1b8;
  uStack_19c = local_1b8;
  uVar61 = 0;
  uVar55 = 0;
  local_228 = vsubps_avx(local_4a8,local_498);
  local_238 = vsubps_avx(local_348,local_4a8);
  local_248 = vsubps_avx(_local_258,local_348);
  local_288 = vsubps_avx(_local_388,local_378);
  local_298 = vsubps_avx(_local_3c8,local_3a8);
  local_2a8 = vsubps_avx(_local_3d8,local_3b8);
  auVar48._4_4_ = fStack_3e4;
  auVar48._0_4_ = local_3e8;
  auVar48._8_4_ = fStack_3e0;
  auVar48._12_4_ = fStack_3dc;
  _local_2b8 = vsubps_avx(auVar48,local_398);
  local_4c8 = ZEXT816(0x3f80000000000000);
  local_268 = local_4c8;
  do {
    auVar12 = vshufps_avx(local_4c8,local_4c8,0x50);
    auVar111._8_4_ = 0x3f800000;
    auVar111._0_8_ = &DAT_3f8000003f800000;
    auVar111._12_4_ = 0x3f800000;
    auVar118._16_4_ = 0x3f800000;
    auVar118._0_16_ = auVar111;
    auVar118._20_4_ = 0x3f800000;
    auVar118._24_4_ = 0x3f800000;
    auVar118._28_4_ = 0x3f800000;
    auVar8 = vsubps_avx(auVar111,auVar12);
    fVar139 = auVar12._0_4_;
    fVar108 = auVar11._0_4_;
    auVar79._0_4_ = fVar108 * fVar139;
    fVar157 = auVar12._4_4_;
    fVar121 = auVar11._4_4_;
    auVar79._4_4_ = fVar121 * fVar157;
    fVar159 = auVar12._8_4_;
    auVar79._8_4_ = fVar108 * fVar159;
    fVar161 = auVar12._12_4_;
    auVar79._12_4_ = fVar121 * fVar161;
    fVar184 = auVar69._0_4_;
    auVar148._0_4_ = fVar184 * fVar139;
    fVar200 = auVar69._4_4_;
    auVar148._4_4_ = fVar200 * fVar157;
    auVar148._8_4_ = fVar184 * fVar159;
    auVar148._12_4_ = fVar200 * fVar161;
    fVar227 = auVar68._0_4_;
    auVar188._0_4_ = fVar227 * fVar139;
    fVar238 = auVar68._4_4_;
    auVar188._4_4_ = fVar238 * fVar157;
    auVar188._8_4_ = fVar227 * fVar159;
    auVar188._12_4_ = fVar238 * fVar161;
    fVar216 = auVar95._0_4_;
    auVar232._0_4_ = fVar216 * fVar139;
    fVar226 = auVar95._4_4_;
    auVar232._4_4_ = fVar226 * fVar157;
    auVar232._8_4_ = fVar216 * fVar159;
    auVar232._12_4_ = fVar226 * fVar161;
    auVar10 = vfmadd231ps_fma(auVar79,auVar8,auVar277);
    auVar83 = vfmadd231ps_fma(auVar148,auVar8,auVar204);
    auVar67 = vfmadd231ps_fma(auVar188,auVar8,auVar85);
    auVar207 = vfmadd231ps_fma(auVar232,auVar96,auVar8);
    auVar12 = vmovshdup_avx(local_268);
    fVar139 = local_268._0_4_;
    fVar63 = (auVar12._0_4_ - fVar139) * 0.04761905;
    auVar215._4_4_ = fVar139;
    auVar215._0_4_ = fVar139;
    auVar215._8_4_ = fVar139;
    auVar215._12_4_ = fVar139;
    auVar215._16_4_ = fVar139;
    auVar215._20_4_ = fVar139;
    auVar215._24_4_ = fVar139;
    auVar215._28_4_ = fVar139;
    auVar105._0_8_ = auVar12._0_8_;
    auVar105._8_8_ = auVar105._0_8_;
    auVar105._16_8_ = auVar105._0_8_;
    auVar105._24_8_ = auVar105._0_8_;
    auVar82 = vsubps_avx(auVar105,auVar215);
    uVar64 = auVar10._0_4_;
    auVar281._4_4_ = uVar64;
    auVar281._0_4_ = uVar64;
    auVar281._8_4_ = uVar64;
    auVar281._12_4_ = uVar64;
    auVar281._16_4_ = uVar64;
    auVar281._20_4_ = uVar64;
    auVar281._24_4_ = uVar64;
    auVar281._28_4_ = uVar64;
    auVar12 = vmovshdup_avx(auVar10);
    uVar164 = auVar12._0_8_;
    auVar264._8_8_ = uVar164;
    auVar264._0_8_ = uVar164;
    auVar264._16_8_ = uVar164;
    auVar264._24_8_ = uVar164;
    fVar65 = auVar83._0_4_;
    auVar93._4_4_ = fVar65;
    auVar93._0_4_ = fVar65;
    auVar93._8_4_ = fVar65;
    auVar93._12_4_ = fVar65;
    auVar93._16_4_ = fVar65;
    auVar93._20_4_ = fVar65;
    auVar93._24_4_ = fVar65;
    auVar93._28_4_ = fVar65;
    auVar8 = vmovshdup_avx(auVar83);
    auVar176._0_8_ = auVar8._0_8_;
    auVar176._8_8_ = auVar176._0_8_;
    auVar176._16_8_ = auVar176._0_8_;
    auVar176._24_8_ = auVar176._0_8_;
    fVar162 = auVar67._0_4_;
    auVar248._4_4_ = fVar162;
    auVar248._0_4_ = fVar162;
    auVar248._8_4_ = fVar162;
    auVar248._12_4_ = fVar162;
    auVar248._16_4_ = fVar162;
    auVar248._20_4_ = fVar162;
    auVar248._24_4_ = fVar162;
    auVar248._28_4_ = fVar162;
    auVar271 = vmovshdup_avx(auVar67);
    auVar225._0_8_ = auVar271._0_8_;
    auVar225._8_8_ = auVar225._0_8_;
    auVar225._16_8_ = auVar225._0_8_;
    auVar225._24_8_ = auVar225._0_8_;
    local_488 = auVar207._0_4_;
    auVar9 = vmovshdup_avx(auVar207);
    auVar109 = vfmadd132ps_fma(auVar82,auVar215,_DAT_02020f20);
    auVar82 = vsubps_avx(auVar118,ZEXT1632(auVar109));
    fVar139 = auVar109._0_4_;
    auVar276._0_4_ = fVar65 * fVar139;
    fVar157 = auVar109._4_4_;
    auVar276._4_4_ = fVar65 * fVar157;
    fVar159 = auVar109._8_4_;
    auVar276._8_4_ = fVar65 * fVar159;
    fVar161 = auVar109._12_4_;
    auVar276._12_4_ = fVar65 * fVar161;
    auVar276._16_4_ = fVar65 * 0.0;
    auVar276._20_4_ = fVar65 * 0.0;
    auVar276._28_36_ = auVar275._28_36_;
    auVar276._24_4_ = fVar65 * 0.0;
    auVar109 = vfmadd231ps_fma(auVar276._0_32_,auVar82,auVar281);
    fVar140 = auVar8._0_4_;
    fVar179 = auVar8._4_4_;
    auVar13._4_4_ = fVar179 * fVar157;
    auVar13._0_4_ = fVar140 * fVar139;
    auVar13._8_4_ = fVar140 * fVar159;
    auVar13._12_4_ = fVar179 * fVar161;
    auVar13._16_4_ = fVar140 * 0.0;
    auVar13._20_4_ = fVar179 * 0.0;
    auVar13._24_4_ = fVar140 * 0.0;
    auVar13._28_4_ = local_488;
    auVar123 = vfmadd231ps_fma(auVar13,auVar82,auVar264);
    auVar14._4_4_ = fVar162 * fVar157;
    auVar14._0_4_ = fVar162 * fVar139;
    auVar14._8_4_ = fVar162 * fVar159;
    auVar14._12_4_ = fVar162 * fVar161;
    auVar14._16_4_ = fVar162 * 0.0;
    auVar14._20_4_ = fVar162 * 0.0;
    auVar14._24_4_ = fVar162 * 0.0;
    auVar14._28_4_ = auVar12._4_4_;
    auVar66 = vfmadd231ps_fma(auVar14,auVar82,auVar93);
    fVar140 = auVar271._0_4_;
    fVar179 = auVar271._4_4_;
    auVar15._4_4_ = fVar179 * fVar157;
    auVar15._0_4_ = fVar140 * fVar139;
    auVar15._8_4_ = fVar140 * fVar159;
    auVar15._12_4_ = fVar179 * fVar161;
    auVar15._16_4_ = fVar140 * 0.0;
    auVar15._20_4_ = fVar179 * 0.0;
    auVar15._24_4_ = fVar140 * 0.0;
    auVar15._28_4_ = uVar64;
    auVar128 = vfmadd231ps_fma(auVar15,auVar82,auVar176);
    auVar12 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar177._0_8_ = auVar12._0_8_;
    auVar177._8_8_ = auVar177._0_8_;
    auVar177._16_8_ = auVar177._0_8_;
    auVar177._24_8_ = auVar177._0_8_;
    auVar8 = vshufps_avx(auVar10,auVar10,0xff);
    uStack_400 = auVar8._0_8_;
    local_408 = (undefined1  [8])uStack_400;
    uStack_3f8 = uStack_400;
    uStack_3f0 = uStack_400;
    auVar16._4_4_ = fVar157 * local_488;
    auVar16._0_4_ = fVar139 * local_488;
    auVar16._8_4_ = fVar159 * local_488;
    auVar16._12_4_ = fVar161 * local_488;
    auVar16._16_4_ = local_488 * 0.0;
    auVar16._20_4_ = local_488 * 0.0;
    auVar16._24_4_ = local_488 * 0.0;
    auVar16._28_4_ = 0x3f800000;
    auVar122 = vfmadd231ps_fma(auVar16,auVar82,auVar248);
    auVar271 = vshufps_avx(auVar83,auVar83,0xaa);
    auVar136._0_8_ = auVar271._0_8_;
    auVar136._8_8_ = auVar136._0_8_;
    auVar136._16_8_ = auVar136._0_8_;
    auVar136._24_8_ = auVar136._0_8_;
    auVar10 = vshufps_avx(auVar83,auVar83,0xff);
    auVar155._0_8_ = auVar10._0_8_;
    auVar155._8_8_ = auVar155._0_8_;
    auVar155._16_8_ = auVar155._0_8_;
    auVar155._24_8_ = auVar155._0_8_;
    fVar140 = auVar9._0_4_;
    fVar179 = auVar9._4_4_;
    auVar255._4_4_ = fVar179 * fVar157;
    auVar255._0_4_ = fVar140 * fVar139;
    auVar255._8_4_ = fVar140 * fVar159;
    auVar255._12_4_ = fVar179 * fVar161;
    auVar255._16_4_ = fVar140 * 0.0;
    auVar255._20_4_ = fVar179 * 0.0;
    auVar255._24_4_ = fVar140 * 0.0;
    auVar255._28_4_ = fVar162;
    auVar141 = vfmadd231ps_fma(auVar255,auVar82,auVar225);
    auVar18._28_4_ = fVar65;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar66._12_4_ * fVar161,
                            CONCAT48(auVar66._8_4_ * fVar159,
                                     CONCAT44(auVar66._4_4_ * fVar157,auVar66._0_4_ * fVar139))));
    auVar109 = vfmadd231ps_fma(auVar18,auVar82,ZEXT1632(auVar109));
    auVar19._28_4_ = auVar8._4_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar128._12_4_ * fVar161,
                            CONCAT48(auVar128._8_4_ * fVar159,
                                     CONCAT44(auVar128._4_4_ * fVar157,auVar128._0_4_ * fVar139))));
    auVar123 = vfmadd231ps_fma(auVar19,auVar82,ZEXT1632(auVar123));
    auVar8 = vshufps_avx(auVar67,auVar67,0xaa);
    uVar164 = auVar8._0_8_;
    auVar254._8_8_ = uVar164;
    auVar254._0_8_ = uVar164;
    auVar254._16_8_ = uVar164;
    auVar254._24_8_ = uVar164;
    auVar9 = vshufps_avx(auVar67,auVar67,0xff);
    uVar164 = auVar9._0_8_;
    auVar273._8_8_ = uVar164;
    auVar273._0_8_ = uVar164;
    auVar273._16_8_ = uVar164;
    auVar273._24_8_ = uVar164;
    auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar122._12_4_,
                                                 CONCAT48(fVar159 * auVar122._8_4_,
                                                          CONCAT44(fVar157 * auVar122._4_4_,
                                                                   fVar139 * auVar122._0_4_)))),
                              auVar82,ZEXT1632(auVar66));
    auVar83 = vshufps_avx(auVar207,auVar207,0xaa);
    auVar67 = vshufps_avx(auVar207,auVar207,0xff);
    local_488 = auVar67._0_4_;
    fStack_484 = auVar67._4_4_;
    auVar20._28_4_ = fStack_484;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(auVar141._12_4_ * fVar161,
                            CONCAT48(auVar141._8_4_ * fVar159,
                                     CONCAT44(auVar141._4_4_ * fVar157,auVar141._0_4_ * fVar139))));
    auVar67 = vfmadd231ps_fma(auVar20,auVar82,ZEXT1632(auVar128));
    auVar207 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar66._12_4_,
                                                  CONCAT48(fVar159 * auVar66._8_4_,
                                                           CONCAT44(fVar157 * auVar66._4_4_,
                                                                    fVar139 * auVar66._0_4_)))),
                               auVar82,ZEXT1632(auVar109));
    auVar13 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar109));
    auVar109 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar67._12_4_,
                                                  CONCAT48(fVar159 * auVar67._8_4_,
                                                           CONCAT44(fVar157 * auVar67._4_4_,
                                                                    fVar139 * auVar67._0_4_)))),
                               auVar82,ZEXT1632(auVar123));
    auVar14 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar123));
    fVar156 = fVar63 * auVar13._0_4_ * 3.0;
    fVar160 = fVar63 * auVar13._4_4_ * 3.0;
    auVar21._4_4_ = fVar160;
    auVar21._0_4_ = fVar156;
    fVar266 = fVar63 * auVar13._8_4_ * 3.0;
    auVar21._8_4_ = fVar266;
    fVar268 = fVar63 * auVar13._12_4_ * 3.0;
    auVar21._12_4_ = fVar268;
    fStack_478 = fVar63 * auVar13._16_4_ * 3.0;
    auVar21._16_4_ = fStack_478;
    fStack_474 = fVar63 * auVar13._20_4_ * 3.0;
    auVar21._20_4_ = fStack_474;
    fStack_470 = fVar63 * auVar13._24_4_ * 3.0;
    auVar21._24_4_ = fStack_470;
    auVar21._28_4_ = 0x40400000;
    local_428._0_4_ = fVar63 * auVar14._0_4_ * 3.0;
    local_428._4_4_ = fVar63 * auVar14._4_4_ * 3.0;
    fStack_420 = fVar63 * auVar14._8_4_ * 3.0;
    fStack_41c = fVar63 * auVar14._12_4_ * 3.0;
    fStack_418 = fVar63 * auVar14._16_4_ * 3.0;
    fStack_414 = fVar63 * auVar14._20_4_ * 3.0;
    fStack_410 = fVar63 * auVar14._24_4_ * 3.0;
    fStack_40c = auVar14._28_4_;
    fVar65 = auVar271._0_4_;
    fVar140 = auVar271._4_4_;
    auVar22._4_4_ = fVar140 * fVar157;
    auVar22._0_4_ = fVar65 * fVar139;
    auVar22._8_4_ = fVar65 * fVar159;
    auVar22._12_4_ = fVar140 * fVar161;
    auVar22._16_4_ = fVar65 * 0.0;
    auVar22._20_4_ = fVar140 * 0.0;
    auVar22._24_4_ = fVar65 * 0.0;
    auVar22._28_4_ = auVar13._28_4_;
    auVar271 = vfmadd231ps_fma(auVar22,auVar82,auVar177);
    fVar65 = auVar10._0_4_;
    fVar179 = auVar10._4_4_;
    auVar23._4_4_ = fVar179 * fVar157;
    auVar23._0_4_ = fVar65 * fVar139;
    auVar23._8_4_ = fVar65 * fVar159;
    auVar23._12_4_ = fVar179 * fVar161;
    auVar23._16_4_ = fVar65 * 0.0;
    auVar23._20_4_ = fVar179 * 0.0;
    auVar23._24_4_ = fVar65 * 0.0;
    auVar23._28_4_ = auVar12._4_4_;
    auVar12 = vfmadd231ps_fma(auVar23,auVar82,_local_408);
    fVar65 = auVar8._0_4_;
    fVar179 = auVar8._4_4_;
    auVar24._4_4_ = fVar179 * fVar157;
    auVar24._0_4_ = fVar65 * fVar139;
    auVar24._8_4_ = fVar65 * fVar159;
    auVar24._12_4_ = fVar179 * fVar161;
    auVar24._16_4_ = fVar65 * 0.0;
    auVar24._20_4_ = fVar179 * 0.0;
    auVar24._24_4_ = fVar65 * 0.0;
    auVar24._28_4_ = fVar63;
    auVar8 = vfmadd231ps_fma(auVar24,auVar82,auVar136);
    fVar65 = auVar9._0_4_;
    fVar162 = auVar9._4_4_;
    auVar25._4_4_ = fVar162 * fVar157;
    auVar25._0_4_ = fVar65 * fVar139;
    auVar25._8_4_ = fVar65 * fVar159;
    auVar25._12_4_ = fVar162 * fVar161;
    auVar25._16_4_ = fVar65 * 0.0;
    auVar25._20_4_ = fVar162 * 0.0;
    auVar25._24_4_ = fVar65 * 0.0;
    auVar25._28_4_ = fVar140;
    auVar9 = vfmadd231ps_fma(auVar25,auVar82,auVar155);
    local_218 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar207));
    fVar65 = auVar83._0_4_;
    fVar140 = auVar83._4_4_;
    auVar26._4_4_ = fVar140 * fVar157;
    auVar26._0_4_ = fVar65 * fVar139;
    auVar26._8_4_ = fVar65 * fVar159;
    auVar26._12_4_ = fVar140 * fVar161;
    auVar26._16_4_ = fVar65 * 0.0;
    auVar26._20_4_ = fVar140 * 0.0;
    auVar26._24_4_ = fVar65 * 0.0;
    auVar26._28_4_ = local_218._28_4_;
    auVar10 = vfmadd231ps_fma(auVar26,auVar82,auVar254);
    _local_408 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar109));
    auVar27._4_4_ = fVar157 * fStack_484;
    auVar27._0_4_ = fVar139 * local_488;
    auVar27._8_4_ = fVar159 * local_488;
    auVar27._12_4_ = fVar161 * fStack_484;
    auVar27._16_4_ = local_488 * 0.0;
    auVar27._20_4_ = fStack_484 * 0.0;
    auVar27._24_4_ = local_488 * 0.0;
    auVar27._28_4_ = fVar179;
    auVar83 = vfmadd231ps_fma(auVar27,auVar82,auVar273);
    auVar28._28_4_ = fVar140;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(fVar161 * auVar8._12_4_,
                            CONCAT48(fVar159 * auVar8._8_4_,
                                     CONCAT44(fVar157 * auVar8._4_4_,fVar139 * auVar8._0_4_))));
    auVar271 = vfmadd231ps_fma(auVar28,auVar82,ZEXT1632(auVar271));
    auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar9._12_4_,
                                                 CONCAT48(fVar159 * auVar9._8_4_,
                                                          CONCAT44(fVar157 * auVar9._4_4_,
                                                                   fVar139 * auVar9._0_4_)))),
                              auVar82,ZEXT1632(auVar12));
    fVar156 = auVar207._0_4_ + fVar156;
    fVar160 = auVar207._4_4_ + fVar160;
    fVar266 = auVar207._8_4_ + fVar266;
    fVar268 = auVar207._12_4_ + fVar268;
    fStack_478 = fStack_478 + 0.0;
    fStack_474 = fStack_474 + 0.0;
    fStack_470 = fStack_470 + 0.0;
    uStack_46c = 0x40400000;
    auVar29._28_4_ = 0x40400000;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar83._12_4_ * fVar161,
                            CONCAT48(auVar83._8_4_ * fVar159,
                                     CONCAT44(auVar83._4_4_ * fVar157,auVar83._0_4_ * fVar139))));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar10._12_4_,
                                                CONCAT48(fVar159 * auVar10._8_4_,
                                                         CONCAT44(fVar157 * auVar10._4_4_,
                                                                  fVar139 * auVar10._0_4_)))),
                             auVar82,ZEXT1632(auVar8));
    auVar9 = vfmadd231ps_fma(auVar29,auVar82,ZEXT1632(auVar9));
    auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar8._12_4_,
                                                 CONCAT48(fVar159 * auVar8._8_4_,
                                                          CONCAT44(fVar157 * auVar8._4_4_,
                                                                   fVar139 * auVar8._0_4_)))),
                              auVar82,ZEXT1632(auVar271));
    auVar83 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar161 * auVar9._12_4_,
                                                 CONCAT48(fVar159 * auVar9._8_4_,
                                                          CONCAT44(fVar157 * auVar9._4_4_,
                                                                   fVar139 * auVar9._0_4_)))),
                              ZEXT1632(auVar12),auVar82);
    auVar82 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar271));
    auVar13 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
    fVar139 = fVar63 * auVar82._0_4_ * 3.0;
    fVar157 = fVar63 * auVar82._4_4_ * 3.0;
    auVar30._4_4_ = fVar157;
    auVar30._0_4_ = fVar139;
    fVar159 = fVar63 * auVar82._8_4_ * 3.0;
    auVar30._8_4_ = fVar159;
    fVar161 = fVar63 * auVar82._12_4_ * 3.0;
    auVar30._12_4_ = fVar161;
    fVar162 = fVar63 * auVar82._16_4_ * 3.0;
    auVar30._16_4_ = fVar162;
    fVar163 = fVar63 * auVar82._20_4_ * 3.0;
    auVar30._20_4_ = fVar163;
    fVar138 = fVar63 * auVar82._24_4_ * 3.0;
    auVar30._24_4_ = fVar138;
    auVar30._28_4_ = 0x40400000;
    auVar199._0_4_ = fVar63 * auVar13._0_4_ * 3.0;
    auVar199._4_4_ = fVar63 * auVar13._4_4_ * 3.0;
    auVar199._8_4_ = fVar63 * auVar13._8_4_ * 3.0;
    auVar199._12_4_ = fVar63 * auVar13._12_4_ * 3.0;
    auVar199._16_4_ = fVar63 * auVar13._16_4_ * 3.0;
    auVar199._20_4_ = fVar63 * auVar13._20_4_ * 3.0;
    auVar199._24_4_ = fVar63 * auVar13._24_4_ * 3.0;
    auVar199._28_4_ = 0;
    local_468 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar10));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar83));
    auVar82 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar207));
    auVar13 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar109));
    auVar15 = vsubps_avx(local_468,local_218);
    fVar158 = auVar82._0_4_ + auVar15._0_4_;
    fVar256 = auVar82._4_4_ + auVar15._4_4_;
    fVar267 = auVar82._8_4_ + auVar15._8_4_;
    fVar180 = auVar82._12_4_ + auVar15._12_4_;
    fVar181 = auVar82._16_4_ + auVar15._16_4_;
    fVar182 = auVar82._20_4_ + auVar15._20_4_;
    fVar183 = auVar82._24_4_ + auVar15._24_4_;
    auVar16 = vsubps_avx(local_78,_local_408);
    auVar265._0_4_ = auVar13._0_4_ + auVar16._0_4_;
    auVar265._4_4_ = auVar13._4_4_ + auVar16._4_4_;
    auVar265._8_4_ = auVar13._8_4_ + auVar16._8_4_;
    auVar265._12_4_ = auVar13._12_4_ + auVar16._12_4_;
    auVar265._16_4_ = auVar13._16_4_ + auVar16._16_4_;
    auVar265._20_4_ = auVar13._20_4_ + auVar16._20_4_;
    auVar265._24_4_ = auVar13._24_4_ + auVar16._24_4_;
    auVar265._28_4_ = auVar13._28_4_ + auVar16._28_4_;
    fVar63 = auVar109._0_4_;
    local_158 = fVar63 + (float)local_428._0_4_;
    fVar65 = auVar109._4_4_;
    fStack_154 = fVar65 + (float)local_428._4_4_;
    fVar140 = auVar109._8_4_;
    fStack_150 = fVar140 + fStack_420;
    fVar179 = auVar109._12_4_;
    fStack_14c = fVar179 + fStack_41c;
    fStack_148 = fStack_418 + 0.0;
    fStack_144 = fStack_414 + 0.0;
    fStack_140 = fStack_410 + 0.0;
    fStack_13c = auVar14._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar207);
    auVar13 = vsubps_avx(local_98,auVar21);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_b8 = ZEXT1632(auVar109);
    auVar13 = vsubps_avx(local_b8,_local_428);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_f8._0_4_ = auVar10._0_4_ + fVar139;
    local_f8._4_4_ = auVar10._4_4_ + fVar157;
    local_f8._8_4_ = auVar10._8_4_ + fVar159;
    local_f8._12_4_ = auVar10._12_4_ + fVar161;
    local_f8._16_4_ = fVar162 + 0.0;
    local_f8._20_4_ = fVar163 + 0.0;
    local_f8._24_4_ = fVar138 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar255 = ZEXT1632(auVar10);
    auVar13 = vsubps_avx(auVar255,auVar30);
    _local_428 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    fVar139 = auVar83._0_4_;
    local_138._0_4_ = fVar139 + auVar199._0_4_;
    fVar157 = auVar83._4_4_;
    local_138._4_4_ = fVar157 + auVar199._4_4_;
    fVar159 = auVar83._8_4_;
    local_138._8_4_ = fVar159 + auVar199._8_4_;
    fVar161 = auVar83._12_4_;
    local_138._12_4_ = fVar161 + auVar199._12_4_;
    local_138._16_4_ = auVar199._16_4_ + 0.0;
    local_138._20_4_ = auVar199._20_4_ + 0.0;
    local_138._24_4_ = auVar199._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar13 = vsubps_avx(ZEXT1632(auVar83),auVar199);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    auVar31._4_4_ = fVar65 * fVar256;
    auVar31._0_4_ = fVar63 * fVar158;
    auVar31._8_4_ = fVar140 * fVar267;
    auVar31._12_4_ = fVar179 * fVar180;
    auVar31._16_4_ = fVar181 * 0.0;
    auVar31._20_4_ = fVar182 * 0.0;
    auVar31._24_4_ = fVar183 * 0.0;
    auVar31._28_4_ = auVar13._28_4_;
    auVar12 = vfnmadd231ps_fma(auVar31,local_98,auVar265);
    auVar32._4_4_ = fStack_154 * fVar256;
    auVar32._0_4_ = local_158 * fVar158;
    auVar32._8_4_ = fStack_150 * fVar267;
    auVar32._12_4_ = fStack_14c * fVar180;
    auVar32._16_4_ = fStack_148 * fVar181;
    auVar32._20_4_ = fStack_144 * fVar182;
    auVar32._24_4_ = fStack_140 * fVar183;
    auVar32._28_4_ = local_428._28_4_;
    auVar45._4_4_ = fVar160;
    auVar45._0_4_ = fVar156;
    auVar45._8_4_ = fVar266;
    auVar45._12_4_ = fVar268;
    auVar45._16_4_ = fStack_478;
    auVar45._20_4_ = fStack_474;
    auVar45._24_4_ = fStack_470;
    auVar45._28_4_ = 0x40400000;
    auVar8 = vfnmadd231ps_fma(auVar32,auVar265,auVar45);
    auVar33._4_4_ = local_178._4_4_ * fVar256;
    auVar33._0_4_ = local_178._0_4_ * fVar158;
    auVar33._8_4_ = local_178._8_4_ * fVar267;
    auVar33._12_4_ = local_178._12_4_ * fVar180;
    auVar33._16_4_ = local_178._16_4_ * fVar181;
    auVar33._20_4_ = local_178._20_4_ * fVar182;
    auVar33._24_4_ = local_178._24_4_ * fVar183;
    auVar33._28_4_ = fStack_13c;
    auVar271 = vfnmadd231ps_fma(auVar33,local_d8,auVar265);
    auVar34._4_4_ = fVar256 * (float)local_408._4_4_;
    auVar34._0_4_ = fVar158 * (float)local_408._0_4_;
    auVar34._8_4_ = fVar267 * (float)uStack_400;
    auVar34._12_4_ = fVar180 * uStack_400._4_4_;
    auVar34._16_4_ = fVar181 * (float)uStack_3f8;
    auVar34._20_4_ = fVar182 * uStack_3f8._4_4_;
    auVar34._24_4_ = fVar183 * (float)uStack_3f0;
    auVar34._28_4_ = local_178._28_4_;
    auVar9 = vfnmadd231ps_fma(auVar34,local_218,auVar265);
    auVar52._4_4_ = fVar157 * fVar256;
    auVar52._0_4_ = fVar139 * fVar158;
    auVar52._8_4_ = fVar159 * fVar267;
    auVar52._12_4_ = fVar161 * fVar180;
    auVar52._16_4_ = fVar181 * 0.0;
    auVar52._20_4_ = fVar182 * 0.0;
    auVar52._24_4_ = fVar183 * 0.0;
    auVar52._28_4_ = DAT_0205d4a0._28_4_;
    auVar10 = vfnmadd231ps_fma(auVar52,auVar255,auVar265);
    auVar35._4_4_ = local_138._4_4_ * fVar256;
    auVar35._0_4_ = local_138._0_4_ * fVar158;
    auVar35._8_4_ = local_138._8_4_ * fVar267;
    auVar35._12_4_ = local_138._12_4_ * fVar180;
    auVar35._16_4_ = local_138._16_4_ * fVar181;
    auVar35._20_4_ = local_138._20_4_ * fVar182;
    auVar35._24_4_ = local_138._24_4_ * fVar183;
    auVar35._28_4_ = local_218._28_4_;
    auVar67 = vfnmadd231ps_fma(auVar35,local_f8,auVar265);
    auVar36._4_4_ = local_118._4_4_ * fVar256;
    auVar36._0_4_ = local_118._0_4_ * fVar158;
    auVar36._8_4_ = local_118._8_4_ * fVar267;
    auVar36._12_4_ = local_118._12_4_ * fVar180;
    auVar36._16_4_ = local_118._16_4_ * fVar181;
    auVar36._20_4_ = local_118._20_4_ * fVar182;
    auVar36._24_4_ = local_118._24_4_ * fVar183;
    auVar36._28_4_ = local_d8._28_4_;
    auVar207 = vfnmadd231ps_fma(auVar36,auVar265,_local_428);
    auVar37._4_4_ = local_78._4_4_ * fVar256;
    auVar37._0_4_ = local_78._0_4_ * fVar158;
    auVar37._8_4_ = local_78._8_4_ * fVar267;
    auVar37._12_4_ = local_78._12_4_ * fVar180;
    auVar37._16_4_ = local_78._16_4_ * fVar181;
    auVar37._20_4_ = local_78._20_4_ * fVar182;
    auVar37._24_4_ = local_78._24_4_ * fVar183;
    auVar37._28_4_ = auVar82._28_4_ + auVar15._28_4_;
    auVar109 = vfnmadd231ps_fma(auVar37,auVar265,local_468);
    auVar13 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar8));
    auVar82 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar8));
    auVar14 = vminps_avx(ZEXT1632(auVar271),ZEXT1632(auVar9));
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar271),ZEXT1632(auVar9));
    auVar82 = vmaxps_avx(auVar82,auVar13);
    auVar15 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar67));
    auVar13 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar67));
    auVar16 = vminps_avx(ZEXT1632(auVar207),ZEXT1632(auVar109));
    auVar15 = vminps_avx(auVar15,auVar16);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar207),ZEXT1632(auVar109));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar82,auVar13);
    auVar51._4_4_ = fStack_194;
    auVar51._0_4_ = local_198;
    auVar51._8_4_ = fStack_190;
    auVar51._12_4_ = fStack_18c;
    auVar51._16_4_ = fStack_188;
    auVar51._20_4_ = fStack_184;
    auVar51._24_4_ = fStack_180;
    auVar51._28_4_ = fStack_17c;
    auVar82 = vcmpps_avx(auVar15,auVar51,2);
    auVar50._4_4_ = uStack_1b4;
    auVar50._0_4_ = local_1b8;
    auVar50._8_4_ = uStack_1b0;
    auVar50._12_4_ = uStack_1ac;
    auVar50._16_4_ = uStack_1a8;
    auVar50._20_4_ = uStack_1a4;
    auVar50._24_4_ = uStack_1a0;
    auVar50._28_4_ = uStack_19c;
    auVar13 = vcmpps_avx(auVar13,auVar50,5);
    auVar82 = vandps_avx(auVar13,auVar82);
    auVar13 = local_1f8 & auVar82;
    uVar53 = 0;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar13 = vsubps_avx(local_218,local_98);
      auVar14 = vsubps_avx(local_468,auVar255);
      fVar163 = auVar13._0_4_ + auVar14._0_4_;
      fVar138 = auVar13._4_4_ + auVar14._4_4_;
      fVar158 = auVar13._8_4_ + auVar14._8_4_;
      fVar256 = auVar13._12_4_ + auVar14._12_4_;
      fVar267 = auVar13._16_4_ + auVar14._16_4_;
      fVar180 = auVar13._20_4_ + auVar14._20_4_;
      fVar181 = auVar13._24_4_ + auVar14._24_4_;
      auVar15 = vsubps_avx(_local_408,local_b8);
      auVar16 = vsubps_avx(local_78,ZEXT1632(auVar83));
      auVar94._0_4_ = auVar15._0_4_ + auVar16._0_4_;
      auVar94._4_4_ = auVar15._4_4_ + auVar16._4_4_;
      auVar94._8_4_ = auVar15._8_4_ + auVar16._8_4_;
      auVar94._12_4_ = auVar15._12_4_ + auVar16._12_4_;
      auVar94._16_4_ = auVar15._16_4_ + auVar16._16_4_;
      auVar94._20_4_ = auVar15._20_4_ + auVar16._20_4_;
      auVar94._24_4_ = auVar15._24_4_ + auVar16._24_4_;
      fVar162 = auVar16._28_4_;
      auVar94._28_4_ = auVar15._28_4_ + fVar162;
      auVar274._0_4_ = fVar63 * fVar163;
      auVar274._4_4_ = fVar65 * fVar138;
      auVar274._8_4_ = fVar140 * fVar158;
      auVar274._12_4_ = fVar179 * fVar256;
      auVar274._16_4_ = fVar267 * 0.0;
      auVar274._20_4_ = fVar180 * 0.0;
      auVar274._24_4_ = fVar181 * 0.0;
      auVar274._28_4_ = 0;
      auVar10 = vfnmadd231ps_fma(auVar274,auVar94,local_98);
      auVar38._4_4_ = fVar138 * fStack_154;
      auVar38._0_4_ = fVar163 * local_158;
      auVar38._8_4_ = fVar158 * fStack_150;
      auVar38._12_4_ = fVar256 * fStack_14c;
      auVar38._16_4_ = fVar267 * fStack_148;
      auVar38._20_4_ = fVar180 * fStack_144;
      auVar38._24_4_ = fVar181 * fStack_140;
      auVar38._28_4_ = fVar162;
      auVar46._4_4_ = fVar160;
      auVar46._0_4_ = fVar156;
      auVar46._8_4_ = fVar266;
      auVar46._12_4_ = fVar268;
      auVar46._16_4_ = fStack_478;
      auVar46._20_4_ = fStack_474;
      auVar46._24_4_ = fStack_470;
      auVar46._28_4_ = 0x40400000;
      auVar12 = vfnmadd213ps_fma(auVar46,auVar94,auVar38);
      auVar39._4_4_ = fVar138 * local_178._4_4_;
      auVar39._0_4_ = fVar163 * local_178._0_4_;
      auVar39._8_4_ = fVar158 * local_178._8_4_;
      auVar39._12_4_ = fVar256 * local_178._12_4_;
      auVar39._16_4_ = fVar267 * local_178._16_4_;
      auVar39._20_4_ = fVar180 * local_178._20_4_;
      auVar39._24_4_ = fVar181 * local_178._24_4_;
      auVar39._28_4_ = fVar162;
      auVar8 = vfnmadd213ps_fma(local_d8,auVar94,auVar39);
      auVar40._4_4_ = (float)local_408._4_4_ * fVar138;
      auVar40._0_4_ = (float)local_408._0_4_ * fVar163;
      auVar40._8_4_ = (float)uStack_400 * fVar158;
      auVar40._12_4_ = uStack_400._4_4_ * fVar256;
      auVar40._16_4_ = (float)uStack_3f8 * fVar267;
      auVar40._20_4_ = uStack_3f8._4_4_ * fVar180;
      auVar40._24_4_ = (float)uStack_3f0 * fVar181;
      auVar40._28_4_ = fVar162;
      auVar83 = vfnmadd231ps_fma(auVar40,auVar94,local_218);
      auVar106._0_4_ = fVar139 * fVar163;
      auVar106._4_4_ = fVar157 * fVar138;
      auVar106._8_4_ = fVar159 * fVar158;
      auVar106._12_4_ = fVar161 * fVar256;
      auVar106._16_4_ = fVar267 * 0.0;
      auVar106._20_4_ = fVar180 * 0.0;
      auVar106._24_4_ = fVar181 * 0.0;
      auVar106._28_4_ = 0;
      auVar67 = vfnmadd231ps_fma(auVar106,auVar94,auVar255);
      auVar41._4_4_ = fVar138 * local_138._4_4_;
      auVar41._0_4_ = fVar163 * local_138._0_4_;
      auVar41._8_4_ = fVar158 * local_138._8_4_;
      auVar41._12_4_ = fVar256 * local_138._12_4_;
      auVar41._16_4_ = fVar267 * local_138._16_4_;
      auVar41._20_4_ = fVar180 * local_138._20_4_;
      auVar41._24_4_ = fVar181 * local_138._24_4_;
      auVar41._28_4_ = local_408._28_4_;
      auVar271 = vfnmadd213ps_fma(local_f8,auVar94,auVar41);
      auVar42._4_4_ = fVar138 * local_118._4_4_;
      auVar42._0_4_ = fVar163 * local_118._0_4_;
      auVar42._8_4_ = fVar158 * local_118._8_4_;
      auVar42._12_4_ = fVar256 * local_118._12_4_;
      auVar42._16_4_ = fVar267 * local_118._16_4_;
      auVar42._20_4_ = fVar180 * local_118._20_4_;
      auVar42._24_4_ = fVar181 * local_118._24_4_;
      auVar42._28_4_ = local_408._28_4_;
      auVar9 = vfnmadd213ps_fma(_local_428,auVar94,auVar42);
      auVar43._4_4_ = local_78._4_4_ * fVar138;
      auVar43._0_4_ = local_78._0_4_ * fVar163;
      auVar43._8_4_ = local_78._8_4_ * fVar158;
      auVar43._12_4_ = local_78._12_4_ * fVar256;
      auVar43._16_4_ = local_78._16_4_ * fVar267;
      auVar43._20_4_ = local_78._20_4_ * fVar180;
      auVar43._24_4_ = local_78._24_4_ * fVar181;
      auVar43._28_4_ = auVar13._28_4_ + auVar14._28_4_;
      auVar207 = vfnmadd231ps_fma(auVar43,auVar94,local_468);
      auVar14 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar12));
      auVar13 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar12));
      auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar83));
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar83));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar16 = vminps_avx(ZEXT1632(auVar67),ZEXT1632(auVar271));
      auVar14 = vmaxps_avx(ZEXT1632(auVar67),ZEXT1632(auVar271));
      auVar255 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar207));
      auVar16 = vminps_avx(auVar16,auVar255);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar207));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vcmpps_avx(auVar16,auVar51,2);
      auVar14 = vcmpps_avx(auVar14,auVar50,5);
      auVar13 = vandps_avx(auVar14,auVar13);
      auVar82 = vandps_avx(auVar82,local_1f8);
      auVar14 = auVar82 & auVar13;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar82 = vandps_avx(auVar13,auVar82);
        uVar53 = vmovmskps_avx(auVar82);
      }
    }
    if (uVar53 != 0) {
      auStack_2f8[uVar55] = uVar53;
      uVar164 = vmovlps_avx(local_268);
      *(undefined8 *)(&uStack_1d8 + uVar55 * 2) = uVar164;
      uVar60 = vmovlps_avx(local_4c8);
      auStack_58[uVar55] = uVar60;
      uVar55 = (ulong)((int)uVar55 + 1);
    }
    do {
      if ((int)uVar55 == 0) {
        if ((uVar61 & 1) != 0) {
          return local_549;
        }
        fVar139 = ray->tfar;
        auVar81._4_4_ = fVar139;
        auVar81._0_4_ = fVar139;
        auVar81._8_4_ = fVar139;
        auVar81._12_4_ = fVar139;
        auVar12 = vcmpps_avx(local_278,auVar81,2);
        uVar53 = vmovmskps_avx(auVar12);
        uVar53 = (uint)uVar62 & uVar53;
        local_549 = uVar53 != 0;
        if (!local_549) {
          return local_549;
        }
        goto LAB_01652e43;
      }
      uVar54 = (int)uVar55 - 1;
      uVar56 = (ulong)uVar54;
      uVar59 = auStack_2f8[uVar56];
      uVar53 = (&uStack_1d8)[uVar56 * 2];
      fVar139 = afStack_1d4[uVar56 * 2];
      iVar17 = 0;
      for (uVar60 = (ulong)uVar59; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
        iVar17 = iVar17 + 1;
      }
      uVar59 = uVar59 - 1 & uVar59;
      if (uVar59 == 0) {
        uVar55 = (ulong)uVar54;
      }
      local_4c8._8_8_ = 0;
      local_4c8._0_8_ = auStack_58[uVar56];
      auStack_2f8[uVar56] = uVar59;
      fVar157 = (float)(iVar17 + 1) * 0.14285715;
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * (float)iVar17 * 0.14285715)),
                                ZEXT416(uVar53),ZEXT416((uint)(1.0 - (float)iVar17 * 0.14285715)));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar157)),ZEXT416(uVar53),
                               ZEXT416((uint)(1.0 - fVar157)));
      auVar275 = ZEXT1664(auVar8);
      fVar157 = auVar12._0_4_;
      local_488 = auVar8._0_4_;
      fVar139 = local_488 - fVar157;
      local_468._0_16_ = auVar12;
      fStack_484 = auVar8._4_4_;
      uStack_480 = auVar8._8_4_;
      uStack_47c = auVar8._12_4_;
      if (0.16666667 <= fVar139) break;
      auVar271 = vshufps_avx(local_4c8,local_4c8,0x50);
      auVar97._8_4_ = 0x3f800000;
      auVar97._0_8_ = &DAT_3f8000003f800000;
      auVar97._12_4_ = 0x3f800000;
      auVar9 = vsubps_avx(auVar97,auVar271);
      fVar159 = auVar271._0_4_;
      auVar112._0_4_ = fVar108 * fVar159;
      fVar161 = auVar271._4_4_;
      auVar112._4_4_ = fVar121 * fVar161;
      fVar63 = auVar271._8_4_;
      auVar112._8_4_ = fVar108 * fVar63;
      fVar65 = auVar271._12_4_;
      auVar112._12_4_ = fVar121 * fVar65;
      auVar126._0_4_ = fVar184 * fVar159;
      auVar126._4_4_ = fVar200 * fVar161;
      auVar126._8_4_ = fVar184 * fVar63;
      auVar126._12_4_ = fVar200 * fVar65;
      auVar149._0_4_ = fVar227 * fVar159;
      auVar149._4_4_ = fVar238 * fVar161;
      auVar149._8_4_ = fVar227 * fVar63;
      auVar149._12_4_ = fVar238 * fVar65;
      auVar86._0_4_ = fVar216 * fVar159;
      auVar86._4_4_ = fVar226 * fVar161;
      auVar86._8_4_ = fVar216 * fVar63;
      auVar86._12_4_ = fVar226 * fVar65;
      auVar271 = vfmadd231ps_fma(auVar112,auVar9,auVar277);
      auVar10 = vfmadd231ps_fma(auVar126,auVar9,auVar204);
      auVar83 = vfmadd231ps_fma(auVar149,auVar9,auVar85);
      auVar9 = vfmadd231ps_fma(auVar86,auVar96,auVar9);
      auVar107._16_16_ = auVar271;
      auVar107._0_16_ = auVar271;
      auVar119._16_16_ = auVar10;
      auVar119._0_16_ = auVar10;
      auVar137._16_16_ = auVar83;
      auVar137._0_16_ = auVar83;
      auVar178._4_4_ = fVar157;
      auVar178._0_4_ = fVar157;
      auVar178._8_4_ = fVar157;
      auVar178._12_4_ = fVar157;
      auVar178._20_4_ = local_488;
      auVar178._16_4_ = local_488;
      auVar178._24_4_ = local_488;
      auVar178._28_4_ = local_488;
      auVar82 = vsubps_avx(auVar119,auVar107);
      auVar10 = vfmadd213ps_fma(auVar82,auVar178,auVar107);
      auVar82 = vsubps_avx(auVar137,auVar119);
      auVar67 = vfmadd213ps_fma(auVar82,auVar178,auVar119);
      auVar271 = vsubps_avx(auVar9,auVar83);
      auVar120._16_16_ = auVar271;
      auVar120._0_16_ = auVar271;
      auVar271 = vfmadd213ps_fma(auVar120,auVar178,auVar137);
      auVar82 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar10));
      auVar9 = vfmadd213ps_fma(auVar82,auVar178,ZEXT1632(auVar10));
      auVar82 = vsubps_avx(ZEXT1632(auVar271),ZEXT1632(auVar67));
      auVar271 = vfmadd213ps_fma(auVar82,auVar178,ZEXT1632(auVar67));
      auVar82 = vsubps_avx(ZEXT1632(auVar271),ZEXT1632(auVar9));
      auVar123 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar82,auVar178);
      fVar179 = auVar82._4_4_ * 3.0;
      fVar140 = fVar139 * 0.33333334;
      local_218._0_8_ =
           CONCAT44(auVar123._4_4_ + fVar140 * fVar179,
                    auVar123._0_4_ + fVar140 * auVar82._0_4_ * 3.0);
      local_218._8_4_ = auVar123._8_4_ + fVar140 * auVar82._8_4_ * 3.0;
      local_218._12_4_ = auVar123._12_4_ + fVar140 * auVar82._12_4_ * 3.0;
      auVar9 = vshufpd_avx(auVar123,auVar123,3);
      auVar10 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_428 = auVar9;
      auVar13 = _local_428;
      auVar271 = vsubps_avx(auVar9,auVar123);
      _local_408 = auVar10;
      auVar83 = vsubps_avx(auVar10,(undefined1  [16])0x0);
      auVar98._0_4_ = auVar271._0_4_ + auVar83._0_4_;
      auVar98._4_4_ = auVar271._4_4_ + auVar83._4_4_;
      auVar98._8_4_ = auVar271._8_4_ + auVar83._8_4_;
      auVar98._12_4_ = auVar271._12_4_ + auVar83._12_4_;
      auVar271 = vshufps_avx(auVar123,auVar123,0xb1);
      auVar83 = vshufps_avx(local_218._0_16_,local_218._0_16_,0xb1);
      auVar258._4_4_ = auVar98._0_4_;
      auVar258._0_4_ = auVar98._0_4_;
      auVar258._8_4_ = auVar98._0_4_;
      auVar258._12_4_ = auVar98._0_4_;
      auVar67 = vshufps_avx(auVar98,auVar98,0x55);
      fVar159 = auVar67._0_4_;
      auVar189._0_4_ = auVar271._0_4_ * fVar159;
      fVar161 = auVar67._4_4_;
      auVar189._4_4_ = auVar271._4_4_ * fVar161;
      fVar63 = auVar67._8_4_;
      auVar189._8_4_ = auVar271._8_4_ * fVar63;
      fVar65 = auVar67._12_4_;
      auVar189._12_4_ = auVar271._12_4_ * fVar65;
      auVar205._0_4_ = auVar83._0_4_ * fVar159;
      auVar205._4_4_ = auVar83._4_4_ * fVar161;
      auVar205._8_4_ = auVar83._8_4_ * fVar63;
      auVar205._12_4_ = auVar83._12_4_ * fVar65;
      auVar207 = vfmadd231ps_fma(auVar189,auVar258,auVar123);
      auVar109 = vfmadd231ps_fma(auVar205,auVar258,local_218._0_16_);
      auVar83 = vshufps_avx(auVar207,auVar207,0xe8);
      auVar67 = vshufps_avx(auVar109,auVar109,0xe8);
      auVar271 = vcmpps_avx(auVar83,auVar67,1);
      uVar53 = vextractps_avx(auVar271,0);
      auVar66 = auVar109;
      if ((uVar53 & 1) == 0) {
        auVar66 = auVar207;
      }
      auVar127._0_4_ = fVar140 * auVar82._16_4_ * 3.0;
      auVar127._4_4_ = fVar140 * fVar179;
      auVar127._8_4_ = fVar140 * auVar82._24_4_ * 3.0;
      auVar127._12_4_ = fVar140 * local_488;
      auVar142 = vsubps_avx((undefined1  [16])0x0,auVar127);
      auVar128 = vshufps_avx(auVar142,auVar142,0xb1);
      auVar122 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar278._0_4_ = auVar128._0_4_ * fVar159;
      auVar278._4_4_ = auVar128._4_4_ * fVar161;
      auVar278._8_4_ = auVar128._8_4_ * fVar63;
      auVar278._12_4_ = auVar128._12_4_ * fVar65;
      auVar99._0_4_ = auVar122._0_4_ * fVar159;
      auVar99._4_4_ = auVar122._4_4_ * fVar161;
      auVar99._8_4_ = auVar122._8_4_ * fVar63;
      auVar99._12_4_ = auVar122._12_4_ * fVar65;
      auVar143 = vfmadd231ps_fma(auVar278,auVar258,auVar142);
      auVar185 = vfmadd231ps_fma(auVar99,(undefined1  [16])0x0,auVar258);
      auVar122 = vshufps_avx(auVar143,auVar143,0xe8);
      auVar141 = vshufps_avx(auVar185,auVar185,0xe8);
      auVar128 = vcmpps_avx(auVar122,auVar141,1);
      uVar53 = vextractps_avx(auVar128,0);
      auVar201 = auVar185;
      if ((uVar53 & 1) == 0) {
        auVar201 = auVar143;
      }
      auVar66 = vmaxss_avx(auVar201,auVar66);
      auVar83 = vminps_avx(auVar83,auVar67);
      auVar67 = vminps_avx(auVar122,auVar141);
      auVar67 = vminps_avx(auVar83,auVar67);
      auVar271 = vshufps_avx(auVar271,auVar271,0x55);
      auVar271 = vblendps_avx(auVar271,auVar128,2);
      auVar128 = vpslld_avx(auVar271,0x1f);
      auVar271 = vshufpd_avx(auVar109,auVar109,1);
      auVar271 = vinsertps_avx(auVar271,auVar185,0x9c);
      auVar83 = vshufpd_avx(auVar207,auVar207,1);
      auVar83 = vinsertps_avx(auVar83,auVar143,0x9c);
      auVar271 = vblendvps_avx(auVar83,auVar271,auVar128);
      auVar83 = vmovshdup_avx(auVar271);
      auVar271 = vmaxss_avx(auVar83,auVar271);
      fVar63 = auVar67._0_4_;
      auVar83 = vmovshdup_avx(auVar67);
      fVar161 = auVar271._0_4_;
      fVar159 = auVar66._0_4_;
      _local_428 = auVar13;
      if ((0.0001 <= fVar63) || (fVar161 <= -0.0001)) {
        auVar207 = vcmpps_avx(auVar83,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar109 = vcmpps_avx(auVar67,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar207 = vorps_avx(auVar109,auVar207);
        if ((-0.0001 < fVar159 & auVar207[0]) != 0) goto LAB_01653e9c;
        auVar207 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar271,5);
        auVar109 = vcmpps_avx(auVar83,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar207 = vorps_avx(auVar109,auVar207);
        if ((auVar207 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_01653e9c;
LAB_01654ac8:
        bVar44 = true;
      }
      else {
LAB_01653e9c:
        auVar109 = vcmpps_avx(auVar67,_DAT_01feba10,1);
        auVar128 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar207 = vcmpss_avx(auVar66,ZEXT816(0) << 0x20,1);
        auVar150._8_4_ = 0x3f800000;
        auVar150._0_8_ = &DAT_3f8000003f800000;
        auVar150._12_4_ = 0x3f800000;
        auVar206._8_4_ = 0xbf800000;
        auVar206._0_8_ = 0xbf800000bf800000;
        auVar206._12_4_ = 0xbf800000;
        auVar207 = vblendvps_avx(auVar150,auVar206,auVar207);
        auVar109 = vblendvps_avx(auVar150,auVar206,auVar109);
        fVar65 = auVar109._0_4_;
        fVar140 = auVar207._0_4_;
        auVar207 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar122 = ZEXT816(0) << 0x20;
        if ((fVar65 == fVar140) && (!NAN(fVar65) && !NAN(fVar140))) {
          auVar207 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar65 == fVar140) && (!NAN(fVar65) && !NAN(fVar140))) {
          auVar128 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar109 = vmovshdup_avx(auVar109);
        fVar179 = auVar109._0_4_;
        if ((fVar65 != fVar179) || (NAN(fVar65) || NAN(fVar179))) {
          fVar65 = auVar83._0_4_;
          if ((fVar65 != fVar63) || (NAN(fVar65) || NAN(fVar63))) {
            auVar100._0_4_ = (float)((uint)fVar63 ^ local_368);
            auVar100._4_4_ = auVar67._4_4_ ^ uStack_364;
            auVar100._8_4_ = auVar67._8_4_ ^ uStack_360;
            auVar100._12_4_ = auVar67._12_4_ ^ uStack_35c;
            auVar129._0_4_ = auVar100._0_4_ / (fVar65 - fVar63);
            auVar129._4_12_ = auVar100._4_12_;
            auVar83 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar129._0_4_)),auVar122,auVar129);
            auVar67 = auVar83;
          }
          else {
            auVar83 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar63 == 0.0) && (auVar83 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar63))) {
              auVar83 = ZEXT816(0);
            }
            auVar67 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar63 == 0.0) && (auVar67 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar63))) {
              auVar67 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar207 = vminss_avx(auVar207,auVar83);
          auVar128 = vmaxss_avx(auVar67,auVar128);
        }
        auVar271 = vcmpss_avx(auVar271,auVar122,1);
        auVar130._8_4_ = 0x3f800000;
        auVar130._0_8_ = &DAT_3f8000003f800000;
        auVar130._12_4_ = 0x3f800000;
        auVar151._8_4_ = 0xbf800000;
        auVar151._0_8_ = 0xbf800000bf800000;
        auVar151._12_4_ = 0xbf800000;
        auVar271 = vblendvps_avx(auVar130,auVar151,auVar271);
        fVar63 = auVar271._0_4_;
        auVar271 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar140 != fVar63) || (NAN(fVar140) || NAN(fVar63))) {
          if ((fVar161 != fVar159) || (NAN(fVar161) || NAN(fVar159))) {
            auVar101._0_4_ = (float)((uint)fVar159 ^ local_368);
            auVar101._4_4_ = auVar66._4_4_ ^ uStack_364;
            auVar101._8_4_ = auVar66._8_4_ ^ uStack_360;
            auVar101._12_4_ = auVar66._12_4_ ^ uStack_35c;
            auVar131._0_4_ = auVar101._0_4_ / (fVar161 - fVar159);
            auVar131._4_12_ = auVar101._4_12_;
            auVar83 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar131._0_4_)),auVar122,auVar131);
            auVar67 = auVar83;
          }
          else {
            auVar83 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar159 == 0.0) && (auVar83 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar159))) {
              auVar83 = ZEXT816(0);
            }
            auVar67 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar159 == 0.0) && (auVar67 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar159))) {
              auVar67 = auVar271;
            }
          }
          auVar207 = vminss_avx(auVar207,auVar83);
          auVar128 = vmaxss_avx(auVar67,auVar128);
        }
        if ((fVar179 != fVar63) || (NAN(fVar179) || NAN(fVar63))) {
          auVar207 = vminss_avx(auVar207,auVar271);
          auVar128 = vmaxss_avx(auVar271,auVar128);
        }
        auVar83 = vmaxss_avx(auVar122,auVar207);
        auVar67 = vminss_avx(auVar128,auVar271);
        bVar44 = true;
        if (auVar83._0_4_ <= auVar67._0_4_) {
          auVar83 = vmaxss_avx(auVar122,ZEXT416((uint)(auVar83._0_4_ + -0.1)));
          auVar271 = vminss_avx(ZEXT416((uint)(auVar67._0_4_ + 0.1)),auVar271);
          auVar87._0_8_ = auVar123._0_8_;
          auVar87._8_8_ = auVar87._0_8_;
          auVar208._8_8_ = local_218._0_8_;
          auVar208._0_8_ = local_218._0_8_;
          auVar221._8_8_ = auVar142._0_8_;
          auVar221._0_8_ = auVar142._0_8_;
          auVar67 = vshufpd_avx(local_218._0_16_,local_218._0_16_,3);
          auVar207 = vshufpd_avx(auVar142,auVar142,3);
          auVar109 = vshufps_avx(auVar83,auVar271,0);
          auVar113._8_4_ = 0x3f800000;
          auVar113._0_8_ = &DAT_3f8000003f800000;
          auVar113._12_4_ = 0x3f800000;
          auVar123 = vsubps_avx(auVar113,auVar109);
          local_428._0_4_ = auVar9._0_4_;
          local_428._4_4_ = auVar9._4_4_;
          fStack_420 = auVar9._8_4_;
          fStack_41c = auVar9._12_4_;
          fVar159 = auVar109._0_4_;
          auVar114._0_4_ = fVar159 * (float)local_428._0_4_;
          fVar161 = auVar109._4_4_;
          auVar114._4_4_ = fVar161 * (float)local_428._4_4_;
          fVar63 = auVar109._8_4_;
          auVar114._8_4_ = fVar63 * fStack_420;
          fVar65 = auVar109._12_4_;
          auVar114._12_4_ = fVar65 * fStack_41c;
          auVar132._0_4_ = auVar67._0_4_ * fVar159;
          auVar132._4_4_ = auVar67._4_4_ * fVar161;
          auVar132._8_4_ = auVar67._8_4_ * fVar63;
          auVar132._12_4_ = auVar67._12_4_ * fVar65;
          auVar152._0_4_ = auVar207._0_4_ * fVar159;
          auVar152._4_4_ = auVar207._4_4_ * fVar161;
          auVar152._8_4_ = auVar207._8_4_ * fVar63;
          auVar152._12_4_ = auVar207._12_4_ * fVar65;
          local_408._0_4_ = auVar10._0_4_;
          local_408._4_4_ = auVar10._4_4_;
          uStack_400._0_4_ = auVar10._8_4_;
          uStack_400._4_4_ = auVar10._12_4_;
          auVar173._0_4_ = fVar159 * (float)local_408._0_4_;
          auVar173._4_4_ = fVar161 * (float)local_408._4_4_;
          auVar173._8_4_ = fVar63 * (float)uStack_400;
          auVar173._12_4_ = fVar65 * uStack_400._4_4_;
          auVar67 = vfmadd231ps_fma(auVar114,auVar123,auVar87);
          auVar207 = vfmadd231ps_fma(auVar132,auVar123,auVar208);
          auVar109 = vfmadd231ps_fma(auVar152,auVar123,auVar221);
          auVar123 = vfmadd231ps_fma(auVar173,auVar123,ZEXT816(0));
          auVar9 = vmovshdup_avx(local_4c8);
          auVar128 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar83._0_4_)),local_4c8,
                                     ZEXT416((uint)(1.0 - auVar83._0_4_)));
          auVar122 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar271._0_4_)),local_4c8,
                                     ZEXT416((uint)(1.0 - auVar271._0_4_)));
          fVar159 = 1.0 / fVar139;
          auVar271 = vsubps_avx(auVar207,auVar67);
          auVar190._0_4_ = auVar271._0_4_ * 3.0;
          auVar190._4_4_ = auVar271._4_4_ * 3.0;
          auVar190._8_4_ = auVar271._8_4_ * 3.0;
          auVar190._12_4_ = auVar271._12_4_ * 3.0;
          auVar271 = vsubps_avx(auVar109,auVar207);
          auVar209._0_4_ = auVar271._0_4_ * 3.0;
          auVar209._4_4_ = auVar271._4_4_ * 3.0;
          auVar209._8_4_ = auVar271._8_4_ * 3.0;
          auVar209._12_4_ = auVar271._12_4_ * 3.0;
          auVar271 = vsubps_avx(auVar123,auVar109);
          auVar222._0_4_ = auVar271._0_4_ * 3.0;
          auVar222._4_4_ = auVar271._4_4_ * 3.0;
          auVar222._8_4_ = auVar271._8_4_ * 3.0;
          auVar222._12_4_ = auVar271._12_4_ * 3.0;
          auVar9 = vminps_avx(auVar209,auVar222);
          auVar271 = vmaxps_avx(auVar209,auVar222);
          auVar9 = vminps_avx(auVar190,auVar9);
          auVar271 = vmaxps_avx(auVar190,auVar271);
          auVar10 = vshufpd_avx(auVar9,auVar9,3);
          auVar83 = vshufpd_avx(auVar271,auVar271,3);
          auVar9 = vminps_avx(auVar9,auVar10);
          auVar271 = vmaxps_avx(auVar271,auVar83);
          auVar210._0_4_ = auVar9._0_4_ * fVar159;
          auVar210._4_4_ = auVar9._4_4_ * fVar159;
          auVar210._8_4_ = auVar9._8_4_ * fVar159;
          auVar210._12_4_ = auVar9._12_4_ * fVar159;
          auVar191._0_4_ = fVar159 * auVar271._0_4_;
          auVar191._4_4_ = fVar159 * auVar271._4_4_;
          auVar191._8_4_ = fVar159 * auVar271._8_4_;
          auVar191._12_4_ = fVar159 * auVar271._12_4_;
          fVar159 = 1.0 / (auVar122._0_4_ - auVar128._0_4_);
          auVar271 = vshufpd_avx(auVar67,auVar67,3);
          auVar9 = vshufpd_avx(auVar207,auVar207,3);
          auVar10 = vshufpd_avx(auVar109,auVar109,3);
          auVar83 = vshufpd_avx(auVar123,auVar123,3);
          auVar271 = vsubps_avx(auVar271,auVar67);
          auVar67 = vsubps_avx(auVar9,auVar207);
          auVar207 = vsubps_avx(auVar10,auVar109);
          auVar83 = vsubps_avx(auVar83,auVar123);
          auVar9 = vminps_avx(auVar271,auVar67);
          auVar271 = vmaxps_avx(auVar271,auVar67);
          auVar10 = vminps_avx(auVar207,auVar83);
          auVar10 = vminps_avx(auVar9,auVar10);
          auVar9 = vmaxps_avx(auVar207,auVar83);
          auVar271 = vmaxps_avx(auVar271,auVar9);
          auVar242._0_4_ = fVar159 * auVar10._0_4_;
          auVar242._4_4_ = fVar159 * auVar10._4_4_;
          auVar242._8_4_ = fVar159 * auVar10._8_4_;
          auVar242._12_4_ = fVar159 * auVar10._12_4_;
          auVar233._0_4_ = fVar159 * auVar271._0_4_;
          auVar233._4_4_ = fVar159 * auVar271._4_4_;
          auVar233._8_4_ = fVar159 * auVar271._8_4_;
          auVar233._12_4_ = fVar159 * auVar271._12_4_;
          auVar10 = vinsertps_avx(auVar12,auVar128,0x10);
          auVar83 = vinsertps_avx(auVar8,auVar122,0x10);
          auVar80._0_4_ = (auVar10._0_4_ + auVar83._0_4_) * 0.5;
          auVar80._4_4_ = (auVar10._4_4_ + auVar83._4_4_) * 0.5;
          auVar80._8_4_ = (auVar10._8_4_ + auVar83._8_4_) * 0.5;
          auVar80._12_4_ = (auVar10._12_4_ + auVar83._12_4_) * 0.5;
          auVar115._4_4_ = auVar80._0_4_;
          auVar115._0_4_ = auVar80._0_4_;
          auVar115._8_4_ = auVar80._0_4_;
          auVar115._12_4_ = auVar80._0_4_;
          auVar8 = vfmadd213ps_fma(local_228,auVar115,local_498);
          auVar271 = vfmadd213ps_fma(local_238,auVar115,local_4a8);
          auVar9 = vfmadd213ps_fma(local_248,auVar115,local_348);
          auVar12 = vsubps_avx(auVar271,auVar8);
          auVar8 = vfmadd213ps_fma(auVar12,auVar115,auVar8);
          auVar12 = vsubps_avx(auVar9,auVar271);
          auVar12 = vfmadd213ps_fma(auVar12,auVar115,auVar271);
          auVar12 = vsubps_avx(auVar12,auVar8);
          auVar8 = vfmadd231ps_fma(auVar8,auVar12,auVar115);
          auVar116._0_8_ = CONCAT44(auVar12._4_4_ * 3.0,auVar12._0_4_ * 3.0);
          auVar116._8_4_ = auVar12._8_4_ * 3.0;
          auVar116._12_4_ = auVar12._12_4_ * 3.0;
          auVar223._8_8_ = auVar8._0_8_;
          auVar223._0_8_ = auVar8._0_8_;
          auVar12 = vshufpd_avx(auVar8,auVar8,3);
          auVar8 = vshufps_avx(auVar80,auVar80,0x55);
          auVar67 = vsubps_avx(auVar12,auVar223);
          auVar109 = vfmadd231ps_fma(auVar223,auVar8,auVar67);
          auVar259._8_8_ = auVar116._0_8_;
          auVar259._0_8_ = auVar116._0_8_;
          auVar12 = vshufpd_avx(auVar116,auVar116,3);
          auVar12 = vsubps_avx(auVar12,auVar259);
          auVar207 = vfmadd213ps_fma(auVar12,auVar8,auVar259);
          auVar8 = vmovshdup_avx(auVar207);
          auVar260._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
          auVar260._8_4_ = auVar8._8_4_ ^ 0x80000000;
          auVar260._12_4_ = auVar8._12_4_ ^ 0x80000000;
          auVar271 = vmovshdup_avx(auVar67);
          auVar12 = vunpcklps_avx(auVar271,auVar260);
          auVar9 = vshufps_avx(auVar12,auVar260,4);
          auVar279._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
          auVar279._8_4_ = auVar67._8_4_ ^ 0x80000000;
          auVar279._12_4_ = auVar67._12_4_ ^ 0x80000000;
          auVar12 = vmovlhps_avx(auVar279,auVar207);
          auVar12 = vshufps_avx(auVar12,auVar207,8);
          auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar67._0_4_)),auVar271,auVar207);
          auVar133._0_4_ = auVar8._0_4_;
          auVar133._4_4_ = auVar133._0_4_;
          auVar133._8_4_ = auVar133._0_4_;
          auVar133._12_4_ = auVar133._0_4_;
          auVar8 = vdivps_avx(auVar9,auVar133);
          auVar271 = vdivps_avx(auVar12,auVar133);
          fVar63 = auVar109._0_4_;
          fVar159 = auVar8._0_4_;
          auVar12 = vshufps_avx(auVar109,auVar109,0x55);
          fVar161 = auVar271._0_4_;
          local_408._4_4_ = fVar63 * auVar8._4_4_ + auVar12._4_4_ * auVar271._4_4_;
          local_408._0_4_ = fVar63 * fVar159 + auVar12._0_4_ * fVar161;
          uStack_400._0_4_ = fVar63 * auVar8._8_4_ + auVar12._8_4_ * auVar271._8_4_;
          uStack_400._4_4_ = fVar63 * auVar8._12_4_ + auVar12._12_4_ * auVar271._12_4_;
          auVar67 = vmovshdup_avx(auVar8);
          auVar12 = vinsertps_avx(auVar210,auVar242,0x1c);
          auVar272._0_4_ = auVar67._0_4_ * auVar12._0_4_;
          auVar272._4_4_ = auVar67._4_4_ * auVar12._4_4_;
          auVar272._8_4_ = auVar67._8_4_ * auVar12._8_4_;
          auVar272._12_4_ = auVar67._12_4_ * auVar12._12_4_;
          auVar9 = vinsertps_avx(auVar191,auVar233,0x1c);
          auVar250._0_4_ = auVar67._0_4_ * auVar9._0_4_;
          auVar250._4_4_ = auVar67._4_4_ * auVar9._4_4_;
          auVar250._8_4_ = auVar67._8_4_ * auVar9._8_4_;
          auVar250._12_4_ = auVar67._12_4_ * auVar9._12_4_;
          auVar123 = vminps_avx(auVar272,auVar250);
          auVar109 = vmaxps_avx(auVar250,auVar272);
          auVar67 = vinsertps_avx(auVar242,auVar210,0x4c);
          auVar66 = vmovshdup_avx(auVar271);
          auVar207 = vinsertps_avx(auVar233,auVar191,0x4c);
          auVar234._0_4_ = auVar66._0_4_ * auVar67._0_4_;
          auVar234._4_4_ = auVar66._4_4_ * auVar67._4_4_;
          auVar234._8_4_ = auVar66._8_4_ * auVar67._8_4_;
          auVar234._12_4_ = auVar66._12_4_ * auVar67._12_4_;
          auVar243._0_4_ = auVar66._0_4_ * auVar207._0_4_;
          auVar243._4_4_ = auVar66._4_4_ * auVar207._4_4_;
          auVar243._8_4_ = auVar66._8_4_ * auVar207._8_4_;
          auVar243._12_4_ = auVar66._12_4_ * auVar207._12_4_;
          auVar66 = vminps_avx(auVar234,auVar243);
          auVar88._0_4_ = auVar66._0_4_ + auVar123._0_4_;
          auVar88._4_4_ = auVar66._4_4_ + auVar123._4_4_;
          auVar88._8_4_ = auVar66._8_4_ + auVar123._8_4_;
          auVar88._12_4_ = auVar66._12_4_ + auVar123._12_4_;
          auVar123 = vmaxps_avx(auVar243,auVar234);
          auVar235._0_4_ = auVar109._0_4_ + auVar123._0_4_;
          auVar235._4_4_ = auVar109._4_4_ + auVar123._4_4_;
          auVar235._8_4_ = auVar109._8_4_ + auVar123._8_4_;
          auVar235._12_4_ = auVar109._12_4_ + auVar123._12_4_;
          auVar244._8_8_ = 0x3f80000000000000;
          auVar244._0_8_ = 0x3f80000000000000;
          auVar109 = vsubps_avx(auVar244,auVar235);
          auVar123 = vsubps_avx(auVar244,auVar88);
          auVar66 = vsubps_avx(auVar10,auVar80);
          auVar261._0_4_ = fVar159 * auVar12._0_4_;
          auVar261._4_4_ = fVar159 * auVar12._4_4_;
          auVar261._8_4_ = fVar159 * auVar12._8_4_;
          auVar261._12_4_ = fVar159 * auVar12._12_4_;
          auVar251._0_4_ = fVar159 * auVar9._0_4_;
          auVar251._4_4_ = fVar159 * auVar9._4_4_;
          auVar251._8_4_ = fVar159 * auVar9._8_4_;
          auVar251._12_4_ = fVar159 * auVar9._12_4_;
          auVar9 = vminps_avx(auVar261,auVar251);
          auVar12 = vmaxps_avx(auVar251,auVar261);
          auVar211._0_4_ = fVar161 * auVar67._0_4_;
          auVar211._4_4_ = fVar161 * auVar67._4_4_;
          auVar211._8_4_ = fVar161 * auVar67._8_4_;
          auVar211._12_4_ = fVar161 * auVar67._12_4_;
          auVar192._0_4_ = fVar161 * auVar207._0_4_;
          auVar192._4_4_ = fVar161 * auVar207._4_4_;
          auVar192._8_4_ = fVar161 * auVar207._8_4_;
          auVar192._12_4_ = fVar161 * auVar207._12_4_;
          auVar67 = vminps_avx(auVar211,auVar192);
          auVar262._0_4_ = auVar9._0_4_ + auVar67._0_4_;
          auVar262._4_4_ = auVar9._4_4_ + auVar67._4_4_;
          auVar262._8_4_ = auVar9._8_4_ + auVar67._8_4_;
          auVar262._12_4_ = auVar9._12_4_ + auVar67._12_4_;
          auVar67 = vsubps_avx(auVar83,auVar80);
          auVar9 = vmaxps_avx(auVar192,auVar211);
          fVar63 = auVar66._0_4_;
          auVar212._0_4_ = fVar63 * auVar109._0_4_;
          fVar65 = auVar66._4_4_;
          auVar212._4_4_ = fVar65 * auVar109._4_4_;
          fVar140 = auVar66._8_4_;
          auVar212._8_4_ = fVar140 * auVar109._8_4_;
          fVar179 = auVar66._12_4_;
          auVar212._12_4_ = fVar179 * auVar109._12_4_;
          auVar193._0_4_ = auVar12._0_4_ + auVar9._0_4_;
          auVar193._4_4_ = auVar12._4_4_ + auVar9._4_4_;
          auVar193._8_4_ = auVar12._8_4_ + auVar9._8_4_;
          auVar193._12_4_ = auVar12._12_4_ + auVar9._12_4_;
          auVar252._8_8_ = 0x3f800000;
          auVar252._0_8_ = 0x3f800000;
          auVar12 = vsubps_avx(auVar252,auVar193);
          auVar9 = vsubps_avx(auVar252,auVar262);
          auVar263._0_4_ = fVar63 * auVar123._0_4_;
          auVar263._4_4_ = fVar65 * auVar123._4_4_;
          auVar263._8_4_ = fVar140 * auVar123._8_4_;
          auVar263._12_4_ = fVar179 * auVar123._12_4_;
          fVar162 = auVar67._0_4_;
          auVar236._0_4_ = fVar162 * auVar109._0_4_;
          fVar163 = auVar67._4_4_;
          auVar236._4_4_ = fVar163 * auVar109._4_4_;
          fVar138 = auVar67._8_4_;
          auVar236._8_4_ = fVar138 * auVar109._8_4_;
          fVar156 = auVar67._12_4_;
          auVar236._12_4_ = fVar156 * auVar109._12_4_;
          auVar89._0_4_ = fVar162 * auVar123._0_4_;
          auVar89._4_4_ = fVar163 * auVar123._4_4_;
          auVar89._8_4_ = fVar138 * auVar123._8_4_;
          auVar89._12_4_ = fVar156 * auVar123._12_4_;
          auVar280._0_4_ = fVar63 * auVar12._0_4_;
          auVar280._4_4_ = fVar65 * auVar12._4_4_;
          auVar280._8_4_ = fVar140 * auVar12._8_4_;
          auVar280._12_4_ = fVar179 * auVar12._12_4_;
          auVar245._0_4_ = fVar63 * auVar9._0_4_;
          auVar245._4_4_ = fVar65 * auVar9._4_4_;
          auVar245._8_4_ = fVar140 * auVar9._8_4_;
          auVar245._12_4_ = fVar179 * auVar9._12_4_;
          auVar194._0_4_ = fVar162 * auVar12._0_4_;
          auVar194._4_4_ = fVar163 * auVar12._4_4_;
          auVar194._8_4_ = fVar138 * auVar12._8_4_;
          auVar194._12_4_ = fVar156 * auVar12._12_4_;
          auVar253._0_4_ = fVar162 * auVar9._0_4_;
          auVar253._4_4_ = fVar163 * auVar9._4_4_;
          auVar253._8_4_ = fVar138 * auVar9._8_4_;
          auVar253._12_4_ = fVar156 * auVar9._12_4_;
          auVar12 = vminps_avx(auVar280,auVar245);
          auVar9 = vminps_avx(auVar194,auVar253);
          auVar12 = vminps_avx(auVar12,auVar9);
          auVar9 = vmaxps_avx(auVar245,auVar280);
          auVar67 = vminps_avx(auVar212,auVar263);
          auVar207 = vminps_avx(auVar236,auVar89);
          auVar67 = vminps_avx(auVar67,auVar207);
          auVar12 = vhaddps_avx(auVar12,auVar67);
          auVar67 = vmaxps_avx(auVar253,auVar194);
          auVar9 = vmaxps_avx(auVar67,auVar9);
          auVar67 = vmaxps_avx(auVar263,auVar212);
          auVar207 = vmaxps_avx(auVar89,auVar236);
          auVar67 = vmaxps_avx(auVar207,auVar67);
          auVar9 = vhaddps_avx(auVar9,auVar67);
          auVar67 = vshufps_avx(auVar80,auVar80,0x54);
          auVar67 = vsubps_avx(auVar67,_local_408);
          auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
          auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
          auVar213._0_4_ = auVar67._0_4_ + auVar12._0_4_;
          auVar213._4_4_ = auVar67._4_4_ + auVar12._4_4_;
          auVar213._8_4_ = auVar67._8_4_ + auVar12._8_4_;
          auVar213._12_4_ = auVar67._12_4_ + auVar12._12_4_;
          auVar195._0_4_ = auVar67._0_4_ + auVar9._0_4_;
          auVar195._4_4_ = auVar67._4_4_ + auVar9._4_4_;
          auVar195._8_4_ = auVar67._8_4_ + auVar9._8_4_;
          auVar195._12_4_ = auVar67._12_4_ + auVar9._12_4_;
          auVar12 = vmaxps_avx(auVar10,auVar213);
          auVar9 = vminps_avx(auVar195,auVar83);
          auVar12 = vcmpps_avx(auVar9,auVar12,1);
          auVar12 = vshufps_avx(auVar12,auVar12,0x50);
          local_4c8 = vinsertps_avx(auVar128,ZEXT416((uint)auVar122._0_4_),0x10);
          if ((auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar12[0xf] < '\0') goto LAB_01654ac8;
          bVar58 = 0;
          if ((fVar157 < auVar213._0_4_) && (bVar58 = 0, auVar195._0_4_ < auVar83._0_4_)) {
            auVar9 = vmovshdup_avx(auVar213);
            auVar12 = vcmpps_avx(auVar195,auVar83,1);
            bVar58 = auVar12[4] & auVar128._0_4_ < auVar9._0_4_;
          }
          if (((3 < (uint)uVar55 || fVar139 < 0.001) | bVar58) == 1) {
            lVar57 = 200;
            do {
              fVar65 = auVar67._0_4_;
              fVar63 = 1.0 - fVar65;
              fVar139 = fVar63 * fVar63 * fVar63;
              fVar157 = fVar65 * 3.0 * fVar63 * fVar63;
              fVar63 = fVar63 * fVar65 * fVar65 * 3.0;
              auVar153._4_4_ = fVar139;
              auVar153._0_4_ = fVar139;
              auVar153._8_4_ = fVar139;
              auVar153._12_4_ = fVar139;
              auVar102._4_4_ = fVar157;
              auVar102._0_4_ = fVar157;
              auVar102._8_4_ = fVar157;
              auVar102._12_4_ = fVar157;
              auVar90._4_4_ = fVar63;
              auVar90._0_4_ = fVar63;
              auVar90._8_4_ = fVar63;
              auVar90._12_4_ = fVar63;
              fVar65 = fVar65 * fVar65 * fVar65;
              auVar174._0_4_ = (float)local_258._0_4_ * fVar65;
              auVar174._4_4_ = (float)local_258._4_4_ * fVar65;
              auVar174._8_4_ = fStack_250 * fVar65;
              auVar174._12_4_ = fStack_24c * fVar65;
              auVar12 = vfmadd231ps_fma(auVar174,local_348,auVar90);
              auVar12 = vfmadd231ps_fma(auVar12,local_4a8,auVar102);
              auVar12 = vfmadd231ps_fma(auVar12,local_498,auVar153);
              auVar91._8_8_ = auVar12._0_8_;
              auVar91._0_8_ = auVar12._0_8_;
              auVar12 = vshufpd_avx(auVar12,auVar12,3);
              auVar9 = vshufps_avx(auVar67,auVar67,0x55);
              auVar12 = vsubps_avx(auVar12,auVar91);
              auVar9 = vfmadd213ps_fma(auVar12,auVar9,auVar91);
              fVar139 = auVar9._0_4_;
              auVar12 = vshufps_avx(auVar9,auVar9,0x55);
              auVar92._0_4_ = fVar159 * fVar139 + fVar161 * auVar12._0_4_;
              auVar92._4_4_ = auVar8._4_4_ * fVar139 + auVar271._4_4_ * auVar12._4_4_;
              auVar92._8_4_ = auVar8._8_4_ * fVar139 + auVar271._8_4_ * auVar12._8_4_;
              auVar92._12_4_ = auVar8._12_4_ * fVar139 + auVar271._12_4_ * auVar12._12_4_;
              auVar67 = vsubps_avx(auVar67,auVar92);
              auVar12 = vandps_avx(local_358,auVar9);
              auVar9 = vshufps_avx(auVar12,auVar12,0xf5);
              auVar12 = vmaxss_avx(auVar9,auVar12);
              if (auVar12._0_4_ < (float)local_448._0_4_) {
                fVar139 = auVar67._0_4_;
                if ((0.0 <= fVar139) && (fVar139 <= 1.0)) {
                  auVar12 = vmovshdup_avx(auVar67);
                  fVar157 = auVar12._0_4_;
                  if ((0.0 <= fVar157) && (fVar157 <= 1.0)) {
                    auVar12 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                            ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c)
                    ;
                    auVar109 = vinsertps_avx(auVar12,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                   [2]),0x28);
                    aVar1 = (ray->org).field_0;
                    auVar12 = vsubps_avx(local_378,(undefined1  [16])aVar1);
                    auVar12 = vdpps_avx(auVar12,auVar109,0x7f);
                    auVar8 = vsubps_avx(local_3a8,(undefined1  [16])aVar1);
                    auVar8 = vdpps_avx(auVar8,auVar109,0x7f);
                    auVar271 = vsubps_avx(local_3b8,(undefined1  [16])aVar1);
                    auVar271 = vdpps_avx(auVar271,auVar109,0x7f);
                    auVar9 = vsubps_avx(local_398,(undefined1  [16])aVar1);
                    auVar9 = vdpps_avx(auVar9,auVar109,0x7f);
                    auVar10 = vsubps_avx(_local_388,(undefined1  [16])aVar1);
                    auVar10 = vdpps_avx(auVar10,auVar109,0x7f);
                    auVar83 = vsubps_avx(_local_3c8,(undefined1  [16])aVar1);
                    auVar83 = vdpps_avx(auVar83,auVar109,0x7f);
                    auVar207 = vsubps_avx(_local_3d8,(undefined1  [16])aVar1);
                    auVar207 = vdpps_avx(auVar207,auVar109,0x7f);
                    auVar49._4_4_ = fStack_3e4;
                    auVar49._0_4_ = local_3e8;
                    auVar49._8_4_ = fStack_3e0;
                    auVar49._12_4_ = fStack_3dc;
                    auVar123 = vsubps_avx(auVar49,(undefined1  [16])aVar1);
                    auVar109 = vdpps_avx(auVar123,auVar109,0x7f);
                    fVar159 = 1.0 - fVar157;
                    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar157)),
                                              ZEXT416((uint)fVar159),auVar12);
                    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ * fVar157)),
                                             ZEXT416((uint)fVar159),auVar8);
                    auVar271 = vfmadd231ss_fma(ZEXT416((uint)(auVar207._0_4_ * fVar157)),
                                               ZEXT416((uint)fVar159),auVar271);
                    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * auVar109._0_4_)),
                                             ZEXT416((uint)fVar159),auVar9);
                    fVar63 = 1.0 - fVar139;
                    fVar157 = fVar63 * fVar139 * fVar139 * 3.0;
                    fVar140 = fVar139 * fVar139 * fVar139;
                    auVar271 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * fVar140)),
                                               ZEXT416((uint)fVar157),auVar271);
                    fVar159 = fVar139 * 3.0 * fVar63 * fVar63;
                    auVar8 = vfmadd231ss_fma(auVar271,ZEXT416((uint)fVar159),auVar8);
                    fVar161 = fVar63 * fVar63 * fVar63;
                    auVar12 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar161),auVar12);
                    fVar65 = auVar12._0_4_;
                    if ((ray->org).field_0.m128[3] <= fVar65) {
                      local_408._0_4_ = ray->tfar;
                      if (fVar65 <= ray->tfar) {
                        pGVar4 = (context->scene->geometries).items[local_430].ptr;
                        if ((pGVar4->mask & ray->mask) == 0) {
                          bVar58 = 0;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar58 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar12 = vshufps_avx(auVar67,auVar67,0x55);
                          auVar214._8_4_ = 0x3f800000;
                          auVar214._0_8_ = &DAT_3f8000003f800000;
                          auVar214._12_4_ = 0x3f800000;
                          auVar8 = vsubps_avx(auVar214,auVar12);
                          fVar179 = auVar12._0_4_;
                          auVar224._0_4_ = fVar179 * (float)local_388._0_4_;
                          fVar162 = auVar12._4_4_;
                          auVar224._4_4_ = fVar162 * (float)local_388._4_4_;
                          fVar163 = auVar12._8_4_;
                          auVar224._8_4_ = fVar163 * fStack_380;
                          fVar138 = auVar12._12_4_;
                          auVar224._12_4_ = fVar138 * fStack_37c;
                          auVar237._0_4_ = fVar179 * (float)local_3c8._0_4_;
                          auVar237._4_4_ = fVar162 * (float)local_3c8._4_4_;
                          auVar237._8_4_ = fVar163 * fStack_3c0;
                          auVar237._12_4_ = fVar138 * fStack_3bc;
                          auVar246._0_4_ = fVar179 * (float)local_3d8._0_4_;
                          auVar246._4_4_ = fVar162 * (float)local_3d8._4_4_;
                          auVar246._8_4_ = fVar163 * fStack_3d0;
                          auVar246._12_4_ = fVar138 * fStack_3cc;
                          auVar196._0_4_ = fVar179 * local_3e8;
                          auVar196._4_4_ = fVar162 * fStack_3e4;
                          auVar196._8_4_ = fVar163 * fStack_3e0;
                          auVar196._12_4_ = fVar138 * fStack_3dc;
                          auVar12 = vfmadd231ps_fma(auVar224,auVar8,local_378);
                          auVar271 = vfmadd231ps_fma(auVar237,auVar8,local_3a8);
                          auVar9 = vfmadd231ps_fma(auVar246,auVar8,local_3b8);
                          auVar10 = vfmadd231ps_fma(auVar196,auVar8,local_398);
                          auVar12 = vsubps_avx(auVar271,auVar12);
                          auVar8 = vsubps_avx(auVar9,auVar271);
                          auVar271 = vsubps_avx(auVar10,auVar9);
                          auVar247._0_4_ = fVar139 * auVar8._0_4_;
                          auVar247._4_4_ = fVar139 * auVar8._4_4_;
                          auVar247._8_4_ = fVar139 * auVar8._8_4_;
                          auVar247._12_4_ = fVar139 * auVar8._12_4_;
                          auVar175._4_4_ = fVar63;
                          auVar175._0_4_ = fVar63;
                          auVar175._8_4_ = fVar63;
                          auVar175._12_4_ = fVar63;
                          auVar12 = vfmadd231ps_fma(auVar247,auVar175,auVar12);
                          auVar197._0_4_ = fVar139 * auVar271._0_4_;
                          auVar197._4_4_ = fVar139 * auVar271._4_4_;
                          auVar197._8_4_ = fVar139 * auVar271._8_4_;
                          auVar197._12_4_ = fVar139 * auVar271._12_4_;
                          auVar8 = vfmadd231ps_fma(auVar197,auVar175,auVar8);
                          auVar198._0_4_ = fVar139 * auVar8._0_4_;
                          auVar198._4_4_ = fVar139 * auVar8._4_4_;
                          auVar198._8_4_ = fVar139 * auVar8._8_4_;
                          auVar198._12_4_ = fVar139 * auVar8._12_4_;
                          auVar8 = vfmadd231ps_fma(auVar198,auVar175,auVar12);
                          auVar154._0_4_ = fVar140 * (float)local_2b8._0_4_;
                          auVar154._4_4_ = fVar140 * (float)local_2b8._4_4_;
                          auVar154._8_4_ = fVar140 * fStack_2b0;
                          auVar154._12_4_ = fVar140 * fStack_2ac;
                          auVar103._4_4_ = fVar157;
                          auVar103._0_4_ = fVar157;
                          auVar103._8_4_ = fVar157;
                          auVar103._12_4_ = fVar157;
                          auVar12 = vfmadd132ps_fma(auVar103,auVar154,local_2a8);
                          auVar134._4_4_ = fVar159;
                          auVar134._0_4_ = fVar159;
                          auVar134._8_4_ = fVar159;
                          auVar134._12_4_ = fVar159;
                          auVar12 = vfmadd132ps_fma(auVar134,auVar12,local_298);
                          auVar104._0_4_ = auVar8._0_4_ * 3.0;
                          auVar104._4_4_ = auVar8._4_4_ * 3.0;
                          auVar104._8_4_ = auVar8._8_4_ * 3.0;
                          auVar104._12_4_ = auVar8._12_4_ * 3.0;
                          auVar117._4_4_ = fVar161;
                          auVar117._0_4_ = fVar161;
                          auVar117._8_4_ = fVar161;
                          auVar117._12_4_ = fVar161;
                          auVar8 = vfmadd132ps_fma(auVar117,auVar12,local_288);
                          auVar12 = vshufps_avx(auVar104,auVar104,0xc9);
                          auVar135._0_4_ = auVar8._0_4_ * auVar12._0_4_;
                          auVar135._4_4_ = auVar8._4_4_ * auVar12._4_4_;
                          auVar135._8_4_ = auVar8._8_4_ * auVar12._8_4_;
                          auVar135._12_4_ = auVar8._12_4_ * auVar12._12_4_;
                          auVar12 = vshufps_avx(auVar8,auVar8,0xc9);
                          auVar8 = vfmsub231ps_fma(auVar135,auVar104,auVar12);
                          auVar12 = vshufps_avx(auVar8,auVar8,0xe9);
                          local_2e8 = vmovlps_avx(auVar12);
                          local_2e0 = auVar8._0_4_;
                          local_2dc = vmovlps_avx(auVar67);
                          local_2d4 = (int)local_338;
                          local_2d0 = (int)local_430;
                          local_2cc = context->user->instID[0];
                          local_2c8 = context->user->instPrimID[0];
                          ray->tfar = fVar65;
                          local_4ac = -1;
                          local_328.valid = &local_4ac;
                          local_328.geometryUserPtr = pGVar4->userPtr;
                          local_328.context = context->user;
                          local_328.hit = (RTCHitN *)&local_2e8;
                          local_328.N = 1;
                          local_328.ray = (RTCRayN *)ray;
                          if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016549a8:
                            p_Var5 = context->args->filter;
                            if (p_Var5 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var5)(&local_328);
                              }
                              if (*local_328.valid == 0) {
                                bVar58 = 0;
                                goto LAB_01654af9;
                              }
                            }
                            bVar58 = 1;
                          }
                          else {
                            stack0xfffffffffffffbdc = auVar13._4_28_;
                            local_428._0_4_ = (int)uVar61;
                            (*pGVar4->occlusionFilterN)(&local_328);
                            uVar61 = (ulong)(uint)local_428._0_4_;
                            if (*local_328.valid != 0) goto LAB_016549a8;
                            bVar58 = 0;
                          }
LAB_01654af9:
                          if (bVar58 == 0) {
                            ray->tfar = (float)local_408._0_4_;
                          }
                        }
                        uVar61 = CONCAT71((int7)(uVar61 >> 8),(byte)uVar61 | bVar58);
                      }
                    }
                  }
                }
                break;
              }
              lVar57 = lVar57 + -1;
            } while (lVar57 != 0);
          }
          else {
            bVar44 = false;
          }
        }
      }
      auVar275 = ZEXT464(0x3f800000);
      auVar12 = local_468._0_16_;
    } while (bVar44);
    local_468._0_16_ = auVar12;
    local_268 = vinsertps_avx(local_468._0_16_,ZEXT416((uint)local_488),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }